

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_schnorrsig_tests(void)

{
  byte *pbVar1;
  byte bVar2;
  MUSIG_ERROR MVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  _func_void_char_ptr_void_ptr *p_Var143;
  void *pvVar144;
  undefined1 auVar145 [16];
  secp256k1_ecmult_gen_context *psVar146;
  uint64_t uVar147;
  uint64_t uVar148;
  uint64_t uVar149;
  uint64_t uVar150;
  uint64_t uVar151;
  uint64_t uVar152;
  int iVar153;
  uint32_t uVar154;
  uint32_t uVar155;
  uint uVar156;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar157;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  secp256k1_musig_partial_sig *psVar158;
  uchar *puVar159;
  uchar *puVar160;
  ulong uVar161;
  ulong uVar162;
  ulong uVar163;
  size_t in_RCX;
  long lVar164;
  ulong uVar165;
  undefined8 *puVar166;
  uint uVar167;
  secp256k1_context *psVar168;
  long lVar169;
  secp256k1_musig_keyagg_cache *cache;
  musig_sign_verify_vector *pmVar170;
  musig_sign_verify_vector *sha2;
  musig_sign_verify_vector *pmVar171;
  musig_sig_agg_vector *pmVar172;
  code *unaff_RBP;
  secp256k1_musig_pubnonce *pubnonce;
  musig_nonce_agg_vector *keyagg_cache;
  ulong uVar173;
  ulong uVar174;
  ulong uVar175;
  musig_sign_verify_vector *pmVar176;
  ulong uVar177;
  size_t in_R8;
  ulong uVar178;
  ulong uVar179;
  secp256k1_schnorrsig_extraparams *pubkey;
  musig_sign_verify_vector *keyagg_cache_00;
  long lVar180;
  ulong uVar181;
  secp256k1_schnorrsig_extraparams *psVar182;
  ulong uVar183;
  code *r;
  secp256k1_schnorrsig_extraparams *keypair;
  musig_sign_verify_vector *pmVar184;
  musig_tweak_vector *cache_i;
  ulong uVar185;
  secp256k1_schnorrsig_extraparams *psVar186;
  musig_sign_verify_vector *aggnonce;
  undefined8 *puVar187;
  byte bVar188;
  musig_key_agg_vector *keyagg_cache_01;
  bool bVar189;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar *args [5];
  uchar nonce_z [32];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  secp256k1_fe sStackY_e28;
  musig_sign_verify_vector *pmStackY_e00;
  musig_sign_verify_vector *pmStackY_df8;
  musig_sign_verify_vector *pmStackY_df0;
  musig_sign_verify_vector *pmStackY_de8;
  musig_sign_verify_vector *pmStackY_de0;
  musig_tweak_vector *pmStackY_dd8;
  secp256k1_musig_partial_sig asStack_d90 [2];
  ulong uStack_d48;
  secp256k1_keypair sStack_d40;
  undefined1 auStack_cb0 [144];
  undefined1 auStack_c20 [64];
  undefined1 auStack_be0 [128];
  undefined1 auStack_b60 [40];
  uchar auStack_b38 [8];
  uchar auStack_b30 [8];
  uchar auStack_b28 [8];
  uchar auStack_b20 [8];
  uchar auStack_b18 [8];
  uchar auStack_b10 [8];
  uchar auStack_b08 [120];
  secp256k1_musig_partial_sig *apsStack_a90 [2];
  secp256k1_pubkey *apsStack_a80 [2];
  secp256k1_musig_pubnonce *apsStack_a70 [2];
  undefined1 auStack_a60 [64];
  undefined1 auStack_a20 [200];
  uchar auStack_958 [8];
  uchar auStack_950 [8];
  uchar auStack_948 [8];
  undefined1 auStack_940 [64];
  undefined1 auStack_900 [128];
  secp256k1_scalar asStack_880 [2];
  secp256k1_scalar asStack_840 [2];
  secp256k1_scalar asStack_800 [6];
  secp256k1_xonly_pubkey sStack_740;
  undefined1 auStack_700 [8];
  secp256k1_keypair *psStack_6f8;
  uchar *puStack_6f0;
  uchar *puStack_6e8;
  uchar *puStack_6e0;
  secp256k1_musig_partial_sig *psStack_6d8;
  uint64_t uStack_6d0;
  uint64_t uStack_6c8;
  uint64_t uStack_6c0;
  uint64_t uStack_6b8;
  uint64_t uStack_6b0;
  uint64_t uStack_6a8;
  size_t sStack_6a0;
  undefined1 auStack_4c0 [144];
  secp256k1_schnorrsig_extraparams *psStack_430;
  secp256k1_schnorrsig_extraparams *psStack_428;
  secp256k1_schnorrsig_extraparams *psStack_420;
  secp256k1_schnorrsig_extraparams *psStack_418;
  secp256k1_schnorrsig_extraparams *psStack_410;
  int local_3ec;
  _func_void_char_ptr_void_ptr *local_3e8;
  void *pvStack_3e0;
  undefined1 local_3d8 [32];
  secp256k1_schnorrsig_extraparams local_3b8;
  undefined1 local_398 [8];
  secp256k1_schnorrsig_extraparams *psStack_390;
  secp256k1_schnorrsig_extraparams *local_388;
  secp256k1_schnorrsig_extraparams *psStack_380;
  secp256k1_context *local_378;
  uint64_t uStack_370;
  uint64_t local_368;
  size_t sStack_360;
  uint64_t local_358;
  uint64_t uStack_350;
  uint64_t local_348;
  uint64_t uStack_340;
  undefined1 local_338 [72];
  uint64_t uStack_2f0;
  uint64_t local_2e8;
  uint64_t uStack_2e0;
  secp256k1_schnorrsig_extraparams local_2d8;
  undefined1 local_2b8 [48];
  undefined1 local_288 [16];
  void *local_278;
  size_t sStack_270;
  size_t local_268;
  size_t sStack_260;
  size_t local_258;
  size_t sStack_250;
  undefined1 local_228 [40];
  uint64_t uStack_200;
  uint64_t local_1f8;
  uint64_t uStack_1f0;
  secp256k1_xonly_pubkey local_1e8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  undefined1 local_a8 [104];
  size_t sStack_40;
  size_t local_38;
  secp256k1_schnorrsig_extraparams *pubkey_00;
  
  psVar182 = &local_3b8;
  local_3b8.noncefp._0_1_ = 'n';
  local_3b8.noncefp._1_1_ = 'o';
  local_3b8.noncefp._2_1_ = 'n';
  local_3b8.noncefp._3_1_ = 'c';
  local_3b8.noncefp._4_1_ = 'e';
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15028f;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = 0xf4bfbff746615b35;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  local_228._16_8_ = (void *)0x5735866160217180;
  local_228._24_8_ = 0x68b07b4c21a29e54;
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1502c3;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1502d7;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonce",0xb);
  local_228._0_8_ = 0x4eba7e7024dd3219;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  local_228._16_8_ = (void *)0x4c44df973afbe4b1;
  local_228._24_8_ = 0x249e850a4aac2739;
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1502fd;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psVar186 = (secp256k1_schnorrsig_extraparams *)(local_338 + 0x80);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15030d;
  testrand256((uchar *)psVar186);
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)(local_338 + 0x40);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15031d;
  testrand256((uchar *)pubkey_00);
  pubkey = (secp256k1_schnorrsig_extraparams *)(local_338 + 0x60);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15032d;
  testrand256((uchar *)pubkey);
  psVar168 = (secp256k1_context *)local_3d8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15033a;
  testrand256((uchar *)psVar168);
  local_398 = (undefined1  [8])psVar186;
  psStack_390 = pubkey_00;
  local_388 = pubkey;
  psStack_380 = psVar182;
  local_378 = psVar168;
  if (0 < COUNT) {
    psVar186 = (secp256k1_schnorrsig_extraparams *)local_398;
    psVar168 = (secp256k1_context *)0x0;
    do {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15037b;
      nonce_function_bip340_bitflip((uchar **)psVar186,0,0x20,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15038d;
      nonce_function_bip340_bitflip((uchar **)psVar186,1,0x20,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15039f;
      nonce_function_bip340_bitflip((uchar **)psVar186,2,0x20,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1503b1;
      nonce_function_bip340_bitflip((uchar **)psVar186,3,0xd,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1503c3;
      nonce_function_bip340_bitflip((uchar **)psVar186,3,0xd,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1503d5;
      nonce_function_bip340_bitflip((uchar **)psVar186,4,0x20,in_RCX,in_R8);
      uVar167 = (int)psVar168 + 1;
      psVar168 = (secp256k1_context *)(ulong)uVar167;
    } while ((int)uVar167 < COUNT);
  }
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15041f;
  iVar153 = nonce_function_bip340
                      (local_288,local_338 + 0x80,0x20,local_338 + 0x40,local_338 + 0x60,
                       local_3b8.magic,0xd,(void *)0x0);
  keypair = psVar182;
  if (iVar153 == 0) goto LAB_001529ad;
  keypair = &local_3b8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150439;
  testrand_bytes_test(keypair->magic,0xd);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150477;
  iVar153 = nonce_function_bip340
                      (local_288,local_338 + 0x80,0x20,local_338 + 0x40,local_338 + 0x60,
                       keypair->magic,0xd,(void *)0x0);
  if (iVar153 == 0) goto LAB_001529b2;
  if (0 < COUNT) {
    psVar168 = (secp256k1_context *)0x0;
    keypair = (secp256k1_schnorrsig_extraparams *)local_338;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)(local_338 + 0x80);
    pubkey = (secp256k1_schnorrsig_extraparams *)(local_338 + 0x40);
    psVar182 = (secp256k1_schnorrsig_extraparams *)(local_338 + 0x60);
    unaff_RBP = (code *)&local_3b8;
    do {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1504bd;
      uVar154 = testrand_int(0x1f);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1504e8;
      iVar153 = nonce_function_bip340
                          ((uchar *)keypair,(uchar *)pubkey_00,(ulong)(uVar154 & 0x1f),
                           (uchar *)pubkey,(uchar *)psVar182,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar153 == 0) goto LAB_001528ef;
      lVar164 = 0;
      do {
        iVar153 = (uint)(byte)local_288[lVar164] - (uint)(byte)local_338[lVar164];
        if (local_288[lVar164] != local_338[lVar164]) goto LAB_0015051b;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x20);
      iVar153 = 0;
LAB_0015051b:
      if (iVar153 == 0) goto LAB_001528f4;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15052d;
      uVar154 = testrand_int(0xc);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150574;
      iVar153 = nonce_function_bip340
                          ((uchar *)keypair,(uchar *)pubkey_00,0x20,(uchar *)pubkey,
                           (uchar *)psVar182,(uchar *)unaff_RBP,((ulong)uVar154 + 0xd) % 0xd,
                           (void *)0x0);
      if (iVar153 == 0) goto LAB_001528f9;
      lVar164 = 0;
      do {
        iVar153 = (uint)(byte)local_288[lVar164] - (uint)(byte)local_338[lVar164];
        if (local_288[lVar164] != local_338[lVar164]) goto LAB_001505a7;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x20);
      iVar153 = 0;
LAB_001505a7:
      psVar157 = psVar168;
      if (iVar153 == 0) goto LAB_001528fe;
      uVar167 = (int)psVar168 + 1;
      psVar168 = (secp256k1_context *)(ulong)uVar167;
    } while ((int)uVar167 < COUNT);
  }
  local_3d8._16_8_ = (undefined1 *)0x0;
  local_3d8._24_8_ = 0;
  local_3d8._0_8_ = 0;
  local_3d8._8_8_ = (code *)0x0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15060b;
  iVar153 = nonce_function_bip340
                      (local_338,local_338 + 0x80,0x20,local_338 + 0x40,local_338 + 0x60,
                       local_3b8.magic,0xd,local_3d8);
  if (iVar153 == 0) goto LAB_001529b7;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150653;
  iVar153 = nonce_function_bip340
                      (local_288,local_338 + 0x80,0x20,local_338 + 0x40,local_338 + 0x60,
                       local_3b8.magic,0xd,(void *)0x0);
  if (iVar153 == 0) goto LAB_001529bc;
  lVar164 = 0;
  do {
    iVar153 = (uint)(byte)local_338[lVar164] - (uint)(byte)local_288[lVar164];
    if (local_338[lVar164] != local_288[lVar164]) goto LAB_00150686;
    lVar164 = lVar164 + 1;
  } while (lVar164 != 0x20);
  iVar153 = 0;
LAB_00150686:
  if (iVar153 != 0) goto LAB_001529c1;
  local_348 = 0;
  uStack_340 = 0;
  local_358 = 0;
  uStack_350 = 0;
  local_368 = 0;
  sStack_360 = 0;
  local_378 = (secp256k1_context *)0x0;
  uStack_370 = 0;
  local_388 = (secp256k1_schnorrsig_extraparams *)0x0;
  psStack_380 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_398 = (undefined1  [8])0x0;
  psStack_390 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_1_ = '\0';
  local_3b8.noncefp._1_1_ = '\0';
  local_3b8.noncefp._2_1_ = '\0';
  local_3b8.noncefp._3_1_ = '\0';
  local_3b8.noncefp._4_1_ = '\0';
  local_3b8.noncefp._5_1_ = '\0';
  local_3b8.noncefp._6_1_ = '\0';
  local_3b8.noncefp._7_1_ = '\0';
  local_a8._96_8_ = 0;
  sStack_40 = 0;
  local_38 = 0;
  psVar168 = (secp256k1_context *)(local_338 + 0x80);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1506fa;
  testrand256((uchar *)psVar168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150707;
  testrand256(local_338 + 0x40);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150714;
  testrand256(local_338 + 0x60);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15071e;
  testrand256(local_3d8);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150735;
  iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)psVar168);
  if (iVar153 == 0) goto LAB_001529c6;
  keypair = (secp256k1_schnorrsig_extraparams *)(local_168 + 0x60);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15075c;
  iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,local_338 + 0x40);
  if (iVar153 == 0) goto LAB_001529cb;
  psVar168 = (secp256k1_context *)(local_168 + 0xc0);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150783;
  iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar168,local_338 + 0x60);
  if (iVar153 == 0) goto LAB_001529d0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1507a9;
  iVar153 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                       (secp256k1_keypair *)local_168);
  if (iVar153 == 0) goto LAB_001529d5;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1507ca;
  iVar153 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)(local_228 + 0x40),(int *)0x0,
                       (secp256k1_keypair *)keypair);
  if (iVar153 == 0) goto LAB_001529da;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1507eb;
  iVar153 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,(secp256k1_keypair *)psVar168);
  if (iVar153 == 0) goto LAB_001529df;
  local_258 = 0;
  sStack_250 = 0;
  local_268 = 0;
  sStack_260 = 0;
  local_278 = (void *)0x0;
  sStack_270 = 0;
  local_288._0_8_ = (void *)0x0;
  local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15084b;
  iVar153 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar157 = CTX;
  if (iVar153 == 0) goto LAB_001529e4;
  local_3ec = 0;
  local_3e8 = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  psVar168 = &secp256k1_context_static_;
  if (CTX == &secp256k1_context_static_) goto LAB_001529e9;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar157->illegal_callback).data = &local_3ec;
  do {
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1508c7;
    iVar153 = secp256k1_schnorrsig_sign_internal
                        (CTX,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152a07;
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152a0c;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a07;
      run_schnorrsig_tests_cold_2();
LAB_00152a07:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a0c;
      run_schnorrsig_tests_cold_3();
      psVar157 = extraout_RAX_00;
LAB_00152a0c:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a20;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150959;
    iVar153 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_338,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152a2a;
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152a2f;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a2a;
      run_schnorrsig_tests_cold_4();
LAB_00152a2a:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a2f;
      run_schnorrsig_tests_cold_5();
      psVar157 = extraout_RAX_01;
LAB_00152a2f:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a43;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1509e9;
    iVar153 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)0x0,nonce_function_bip340
                         ,(void *)0x0);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152a4d;
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152a52;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a4d;
      run_schnorrsig_tests_cold_6();
LAB_00152a4d:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a52;
      run_schnorrsig_tests_cold_7();
      psVar157 = extraout_RAX_02;
LAB_00152a52:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a66;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150a7b;
    iVar153 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_398,
                         nonce_function_bip340,(void *)0x0);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      psVar157 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_00152a70;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (STATIC_CTX == psVar168) goto LAB_00152a75;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a70;
      run_schnorrsig_tests_cold_8();
LAB_00152a70:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a75;
      run_schnorrsig_tests_cold_9();
      psVar157 = extraout_RAX_03;
LAB_00152a75:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a89;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150b14;
    iVar153 = secp256k1_schnorrsig_sign_internal
                        (STATIC_CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar157 = STATIC_CTX;
    if (iVar153 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152a93;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150b65;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,&local_3b8);
      psVar157 = CTX;
      if (iVar153 == 0) goto LAB_00152a98;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (CTX == psVar168) goto LAB_00152a9d;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a93;
      run_schnorrsig_tests_cold_10();
LAB_00152a93:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a98;
      run_schnorrsig_tests_cold_11();
LAB_00152a98:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152a9d;
      run_schnorrsig_tests_cold_84();
      psVar157 = extraout_RAX_04;
LAB_00152a9d:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ab1;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150bd0;
    iVar153 = secp256k1_schnorrsig_sign_custom
                        (CTX,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,&local_3b8);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152abb;
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152ac0;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152abb;
      run_schnorrsig_tests_cold_12();
LAB_00152abb:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ac0;
      run_schnorrsig_tests_cold_13();
      psVar157 = extraout_RAX_05;
LAB_00152ac0:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ad4;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150c58;
    iVar153 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,&local_3b8);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152ade;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150c9c;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (psVar157,local_338,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                           &local_3b8);
      psVar157 = CTX;
      if (iVar153 == 0) goto LAB_00152ae3;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (CTX == psVar168) goto LAB_00152ae8;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ade;
      run_schnorrsig_tests_cold_14();
LAB_00152ade:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ae3;
      run_schnorrsig_tests_cold_15();
LAB_00152ae3:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ae8;
      run_schnorrsig_tests_cold_83();
      psVar157 = extraout_RAX_06;
LAB_00152ae8:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152afc;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150d08;
    iVar153 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)0x0,&local_3b8);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152b06;
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152b0b;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b06;
      run_schnorrsig_tests_cold_16();
LAB_00152b06:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b0b;
      run_schnorrsig_tests_cold_17();
      psVar157 = extraout_RAX_07;
LAB_00152b0b:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b1f;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150d90;
    iVar153 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_398,&local_3b8);
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152b29;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150de0;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (psVar157,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      psVar157 = CTX;
      if (iVar153 == 0) goto LAB_00152b2e;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (CTX == psVar168) goto LAB_00152b33;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b29;
      run_schnorrsig_tests_cold_18();
LAB_00152b29:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b2e;
      run_schnorrsig_tests_cold_19();
LAB_00152b2e:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b33;
      run_schnorrsig_tests_cold_82();
      psVar157 = extraout_RAX_08;
LAB_00152b33:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b47;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150e54;
    iVar153 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         (secp256k1_schnorrsig_extraparams *)(local_a8 + 0x60));
    psVar157 = CTX;
    if (iVar153 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      psVar157 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_00152b51;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (STATIC_CTX == psVar168) goto LAB_00152b56;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b51;
      run_schnorrsig_tests_cold_20();
LAB_00152b51:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b56;
      run_schnorrsig_tests_cold_21();
      psVar157 = extraout_RAX_09;
LAB_00152b56:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b6a;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150ee3;
    iVar153 = secp256k1_schnorrsig_sign_custom
                        (STATIC_CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
    psVar157 = STATIC_CTX;
    if (iVar153 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar157->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00152b74;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150f3e;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar153 == 0) goto LAB_00152b79;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150f6c;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,local_338,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
      psVar157 = CTX;
      if (iVar153 == 0) goto LAB_00152b7e;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (CTX == psVar168) goto LAB_00152b83;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b74;
      run_schnorrsig_tests_cold_22();
LAB_00152b74:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b79;
      run_schnorrsig_tests_cold_23();
LAB_00152b79:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b7e;
      run_schnorrsig_tests_cold_81();
LAB_00152b7e:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b83;
      run_schnorrsig_tests_cold_80();
      psVar157 = extraout_RAX_10;
LAB_00152b83:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152b97;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x150fcd;
    (*(CTX->illegal_callback).fn)("sig64 != NULL",(CTX->illegal_callback).data);
    psVar157 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar157->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152ba1;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152ba1;
      run_schnorrsig_tests_cold_24();
      psVar157 = extraout_RAX_11;
LAB_00152ba1:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152bb5;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151040;
    (*(CTX->illegal_callback).fn)("msg != NULL || msglen == 0",(CTX->illegal_callback).data);
    psVar157 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar157->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151077;
      iVar153 = secp256k1_schnorrsig_verify
                          (psVar157,local_338,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228);
      psVar157 = CTX;
      if (iVar153 != 0) goto LAB_00152bbf;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (CTX == psVar168) goto LAB_00152bc4;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152bbf;
      run_schnorrsig_tests_cold_25();
LAB_00152bbf:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152bc4;
      run_schnorrsig_tests_cold_26();
      psVar157 = extraout_RAX_12;
LAB_00152bc4:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152bd8;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1510d8;
    (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
    psVar157 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar157->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      local_3ec = 0;
      local_3e8 = (psVar157->illegal_callback).fn;
      pvStack_3e0 = (psVar157->illegal_callback).data;
      if (psVar157 == psVar168) goto LAB_00152be2;
      (psVar157->illegal_callback).fn = counting_callback_fn;
      (psVar157->illegal_callback).data = &local_3ec;
    }
    else {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152be2;
      run_schnorrsig_tests_cold_27();
      psVar157 = extraout_RAX_13;
LAB_00152be2:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152bf6;
      (*(psVar157->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
    }
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151156;
    iVar153 = secp256k1_schnorrsig_verify
                        (CTX,local_338,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_288);
    psVar157 = CTX;
    if (iVar153 != 0) {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c00;
      run_schnorrsig_tests_cold_28();
LAB_00152c00:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c05;
      run_schnorrsig_tests_cold_29();
LAB_00152c05:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c0a;
      run_schnorrsig_tests_cold_30();
LAB_00152c0a:
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c0f;
      run_schnorrsig_tests_cold_31();
      goto LAB_00152c0f;
    }
    (CTX->illegal_callback).fn = local_3e8;
    (psVar157->illegal_callback).data = pvStack_3e0;
    if (local_3ec != 1) goto LAB_00152c00;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151198;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228._0_8_ = 0x239253819cecba11;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
    local_228._16_8_ = (void *)0x3cc76597c87550;
    local_228._24_8_ = 0x33e9b66a90f61164;
    local_1e8.data[0x20] = '@';
    local_1e8.data[0x21] = '\0';
    local_1e8.data[0x22] = '\0';
    local_1e8.data[0x23] = '\0';
    local_1e8.data[0x24] = '\0';
    local_1e8.data[0x25] = '\0';
    local_1e8.data[0x26] = '\0';
    local_1e8.data[0x27] = '\0';
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1511c8;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_228._16_8_ = (void *)0x0;
    local_228._24_8_ = 0x300000000000000;
    local_228._0_8_ = 0;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xb0996f8345c831b5;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
    local_398 = (undefined1  [8])0x10c35892018a30f9;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x29529df8854f3449;
    local_278 = (void *)0x0;
    sStack_270 = 0;
    local_288._0_8_ = (void *)0x0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_338._16_8_ = (void *)0x0;
    local_338._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    local_338._0_8_ = 0;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_168._48_8_ = 0x472f17b2fde8eeeb;
    local_168._56_8_ = 0xc03605310d90f47d;
    local_168._32_8_ = 0x718bea854a6af625;
    local_168._40_8_ = 0xe52c2d384fa782e4;
    local_168._16_8_ = (void *)0x8b007835f1cdf4b;
    local_168._24_8_ = 0x1582ca2dcef1554c;
    local_168._0_8_ = (void *)0x108d84801f8307e9;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x361024401b37a569;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151279;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338,0x20,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151292;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
    local_228._16_8_ = (void *)0x56dab4380f16e762;
    local_228._24_8_ = 0xefcf905104d984a7;
    local_228._0_8_ = 0x6a2aed8a6251e1b7;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd8cedea21daefe58;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
    local_398 = (undefined1  [8])0x5f1c672a7fd7f1df;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xbe4123db26371836;
    local_278 = (void *)0;
    sStack_270._0_1_ = '\0';
    sStack_270._1_1_ = '\0';
    sStack_270._2_1_ = '\0';
    sStack_270._3_1_ = '\0';
    sStack_270._4_1_ = '\0';
    sStack_270._5_1_ = '\0';
    sStack_270._6_1_ = '\0';
    sStack_270._7_1_ = '\x01';
    local_288[0] = '\0';
    local_288[1] = '\0';
    local_288[2] = '\0';
    local_288[3] = '\0';
    local_288[4] = '\0';
    local_288[5] = '\0';
    local_288[6] = '\0';
    local_288[7] = '\0';
    local_288[8] = '\0';
    local_288[9] = '\0';
    local_288[10] = '\0';
    local_288[0xb] = '\0';
    local_288[0xc] = '\0';
    local_288[0xd] = '\0';
    local_288[0xe] = '\0';
    local_288[0xf] = '\0';
    local_338._16_8_ = (void *)0xd0319f29223809a4;
    local_338._24_8_ = (_func_void_char_ptr_void_ptr *)0x896c4eec98fa2e08;
    local_338._0_8_ = 0xd308a385886a3f24;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    local_168._48_8_ = 0x1c87ea39b6fc7e89;
    local_168._56_8_ = 0xa4b9e33def695fa;
    local_168._32_8_ = 0xccab76c91ad10689;
    local_168._40_8_ = 0xeaf4bf9212090bb2;
    local_168._16_8_ = (void *)0x17f9436d3e41de1b;
    local_168._24_8_ = 0x4133de788ccf8ddc;
    local_168._0_8_ = (void *)0x6d29aeee60bd9668;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x7fe1df79f228ab4;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15135f;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338,0x20,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151378;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
    local_228._16_8_ = (void *)0x74cc678a084e0229;
    local_228._24_8_ = 0xc9e5143ba6be0b02;
    local_228._0_8_ = 0x34c26821a2da0fc9;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xc986b00953713901;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
    local_398 = (undefined1  [8])0x137e77c5fe8a30dd;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xccb7c19c2ba71f12;
    local_278 = (void *)0x2c69d1c6cd760e08;
    sStack_270 = 0x6d9e698d7620b4b;
    local_288._0_8_ = (void *)0xaed7b42438a57ac8;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0xccbcbbb5a235b02e;
    local_338._16_8_ = (void *)0x33776cb5aa0598da;
    local_338._24_8_ = (_func_void_char_ptr_void_ptr *)0x5cb708a5d0b92430;
    local_338._0_8_ = 0x1adfbcb3d8582d7e;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
    local_168._48_8_ = 0x1e48f8828da9de7a;
    local_168._56_8_ = 0xb73f6f4a67031e0e;
    local_168._32_8_ = 0x4a95ada5795874ab;
    local_168._40_8_ = 0x3c1da5c3915ac472;
    local_168._16_8_ = (void *)0x8b8d72602acf9bc4;
    local_168._24_8_ = 0x1b3c31dd500f204c;
    local_168._0_8_ = (void *)0xb74bb4d7eeaa3158;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x94429dba94ab5e4e;
    psVar182 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151441;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar182,local_398,local_288,local_338,0x20,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15145a;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,0x20,local_168,1);
    local_228._16_8_ = (void *)0x54a23fcf62307712;
    local_228._24_8_ = 0x101740d28ef5449e;
    local_228._0_8_ = 0x81739377262b430b;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
    local_388 = (secp256k1_schnorrsig_extraparams *)0x8a461df2fb950d3a;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
    local_398 = (undefined1  [8])0x25f50551f9dfd125;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xad96a928f622403c;
    local_278 = (void *)0xffffffffffffffff;
    sStack_270 = 0xffffffffffffffff;
    local_288._0_8_ = (void *)0xffffffffffffffff;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    local_338._16_8_ = (void *)0xffffffffffffffff;
    local_338._24_8_ = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
    local_338._0_8_ = 0xffffffffffffffff;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    local_168._48_8_ = 0x27b3eb8188d75ff2;
    local_168._56_8_ = 0xa36ec6ef2259fc71;
    local_168._32_8_ = 0x93b33db19c2b5897;
    local_168._40_8_ = 0x5aaf82a92bb30537;
    local_168._16_8_ = (void *)0xb651dd87a1c1ec65;
    local_168._24_8_ = 0xecd53796dc1eda4f;
    local_168._0_8_ = (void *)0xf146e2579750b07e;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xb91c615156884994;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_228;
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    pubkey = (secp256k1_schnorrsig_extraparams *)local_338;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15150e;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)pubkey_00,(uchar *)keypair,local_288,(uchar *)pubkey,0x20,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151527;
    test_schnorrsig_bip_vectors_check_verify((uchar *)keypair,(uchar *)pubkey,0x20,local_168,1);
    local_228._16_8_ = (void *)0xaae28b6d7430fa7d;
    local_228._24_8_ = 0xb9c72dd2295f9765;
    local_228._0_8_ = 0x12e499bb09359cd6;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
    local_388 = (secp256k1_schnorrsig_extraparams *)0x9b591ac87578f199;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    local_398 = (undefined1  [8])0xb283cc8ff6c3f34d;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x24a73104c9429d7e;
    local_168._48_8_ = 0x93f5804ec071cb60;
    local_168._56_8_ = 0xf4d70883d2070b06;
    local_168._32_8_ = 0xb303f68a54b1af76;
    local_168._40_8_ = 0x10ee7d20f8c945eb;
    local_168._16_8_ = (void *)0x28aaf51494eda089;
    local_168._24_8_ = 0x639c5f79d6960dad;
    local_168._0_8_ = (void *)0x0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3f56ce783b000000;
    psVar168 = (secp256k1_context *)local_228;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1515a8;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar168,local_398,0x20,local_168,1);
    local_228._16_8_ = (void *)0x8776b979ae9898eb;
    local_228._24_8_ = 0x344a2d4aa0fae466;
    local_228._0_8_ = 0x507767db4ceafdee;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1515d9;
    iVar153 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar153 != 0) goto LAB_00152c05;
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0x5ebe66e143c6737a;
    local_168._56_8_ = 0xe253c51a4ba3afbe;
    local_168._32_8_ = 0x7c60a644479c23c;
    local_168._40_8_ = 0xefd92309e17a10cd;
    local_168._16_8_ = (void *)0x8ba168852f47f682;
    local_168._24_8_ = 0x56752960147a052f;
    local_168._0_8_ = (void *)0xa4ee5e75d57bf9ff;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xd3355235143a4520;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151665;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0x355754fe4c952a62;
    local_168._56_8_ = 0xbdb2cdfc3451eaaa;
    local_168._32_8_ = 0x89716edb3e0b8928;
    local_168._40_8_ = 0xf8e45c518b4430b6;
    local_168._16_8_ = (void *)0xf46f3fdf13b032b4;
    local_168._24_8_ = 0x5f51e1e033cb9ff9;
    local_168._0_8_ = (void *)0x1cc2db1e332ea61f;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xa70011abd2924739;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1516e9;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0xcedc5003ec9d7e8;
    local_168._56_8_ = 0xa66d2e0c0dff3418;
    local_168._32_8_ = 0xfc2f9baab3641796;
    local_168._40_8_ = 0x26a287687b94efb6;
    local_168._16_8_ = (void *)0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = (void *)0xea696ca83b5cff6c;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15176f;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0xdc94d5f07634b74f;
    local_168._56_8_ = 0x516018bd25645cb6;
    local_168._32_8_ = 0x239caf2883da3d12;
    local_168._40_8_ = 0xba23d1cfee1f4ca9;
    local_168._16_8_ = (void *)0x0;
    local_168._24_8_ = 0;
    local_168._0_8_ = (void *)0x0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1517f5;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0xf95467ac117fa8db;
    local_168._56_8_ = 0x97f17c83a1d58037;
    local_168._32_8_ = 0x6488e25aaffb1576;
    local_168._40_8_ = 0xb4adde4297093c01;
    local_168._16_8_ = (void *)0x0;
    local_168._24_8_ = 0x100000000000000;
    local_168._0_8_ = (void *)0x0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15187b;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0x2fb382aea813d7d1;
    local_168._56_8_ = 0x9bd307c47f5f9da7;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168._40_8_ = 0xd75d7897846b1049;
    local_168._16_8_ = (void *)0xc79b260f2ba84d56;
    local_168._24_8_ = 0x1dba290422f8740a;
    local_168._0_8_ = (void *)0x5a3957aeac8d294a;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xcb1dfddb5d79d015;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151901;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0x2fb382aea813d7d1;
    local_168._56_8_ = 0x9bd307c47f5f9da7;
    local_168._32_8_ = 0x3d064554c9be869;
    local_168._40_8_ = 0xd75d7897846b1049;
    local_168._16_8_ = (void *)0xffffffffffffffff;
    local_168._24_8_ = 0x2ffcfffffeffffff;
    local_168._0_8_ = (void *)0xffffffffffffffff;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_168;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151987;
    test_schnorrsig_bip_vectors_check_verify(local_228,(uchar *)keypair,0x20,(uchar *)pubkey_00,0);
    local_228._16_8_ = (void *)0xd8cedea21daefe58;
    local_228._24_8_ = 0x59a62b507b0f2443;
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_schnorrsig_extraparams *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    local_168._48_8_ = 0x3ba048afe6dcaeba;
    local_168._56_8_ = 0x414136d08c5ed2bf;
    local_168._32_8_ = 0xffffffffffffffff;
    local_168._40_8_ = 0xfeffffffffffffff;
    local_168._16_8_ = (void *)0x96d9b2896097c174;
    local_168._24_8_ = 0x6977173e54e5a23d;
    local_168._0_8_ = (void *)0xea696ca83b5cff6c;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psVar168 = (secp256k1_context *)local_228;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151a07;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar168,local_398,0x20,local_168,0);
    local_228._16_8_ = (void *)0xffffffffffffffff;
    local_228._24_8_ = 0x30fcfffffeffffff;
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151a38;
    iVar153 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar153 != 0) goto LAB_00152c0a;
    local_228._16_8_ = (void *)0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_schnorrsig_extraparams *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398 = (undefined1  [8])0xc43a39b453aa8c77;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = (void *)0x0;
    sStack_270 = 0;
    local_288._0_8_ = (void *)0x0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_168._48_8_ = 0x272865ac0f562d9f;
    local_168._56_8_ = 0x63ab27e47405afd1;
    local_168._32_8_ = 0x624603bf26ce6960;
    local_168._40_8_ = 0x648adb623a9af128;
    local_168._16_8_ = (void *)0xccfc326743adb66b;
    local_168._24_8_ = 0xcf645489551a2925;
    local_168._0_8_ = (void *)0xfbd9ec65b15d5371;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x1861eafa5f6e04bc;
    local_2b8._40_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151ae8;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,(uchar *)0x0,0,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151afd;
    test_schnorrsig_bip_vectors_check_verify(local_398,(uchar *)0x0,0,local_168,1);
    local_228._16_8_ = (void *)0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_schnorrsig_extraparams *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398 = (undefined1  [8])0xc43a39b453aa8c77;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = (void *)0x0;
    sStack_270 = 0;
    local_288._0_8_ = (void *)0x0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
    local_338[0] = 0x11;
    local_168._48_8_ = 0x337d575afcac7cfe;
    local_168._56_8_ = 0xbfac2bec4c5614ec;
    local_168._32_8_ = 0xbd8366eabf7331ea;
    local_168._40_8_ = 0x9619bc5daaa51f10;
    local_168._16_8_ = (void *)0x354c3be64a93b9b1;
    local_168._24_8_ = 0x3a3c63411aef311;
    local_168._0_8_ = (void *)0x2441f6fe0a0aa208;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3a583c69e0329264;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151bab;
    test_schnorrsig_bip_vectors_check_signing(local_228,local_398,local_288,local_338,1,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151bc4;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338,1,local_168,1);
    local_228._16_8_ = (void *)0x4003400340034003;
    local_228._24_8_ = 0x4003400340034003;
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_schnorrsig_extraparams *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398 = (undefined1  [8])0xc43a39b453aa8c77;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = (void *)0x0;
    sStack_270 = 0;
    local_288._0_8_ = (void *)0x0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_338[0x10] = 0x11;
    local_338._0_8_ = 0x807060504030201;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
    local_168._48_8_ = 0x515a0ed87fa3e5e1;
    local_168._56_8_ = 0xa5a57ea966557c89;
    local_168._32_8_ = 0xf860f97bb782a4c4;
    local_168._40_8_ = 0xec71675be2401568;
    local_168._16_8_ = (void *)0x523c1ea7d199865d;
    local_168._24_8_ = 0x70c30ab5b6fd9ada;
    local_168._0_8_ = (void *)0x3bb459409af33051;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x2be5ec199ac0cac7;
    keypair = (secp256k1_schnorrsig_extraparams *)local_228;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151c7d;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)keypair,(uchar *)pubkey_00,local_288,local_338,0x11,local_168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151c96;
    test_schnorrsig_bip_vectors_check_verify((uchar *)pubkey_00,local_338,0x11,local_168,1);
    local_388 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_398 = (undefined1  [8])0x4003400340034003;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_278 = (void *)0x238be6f6b6faf94b;
    sStack_270 = 0x17d16f4d32976408;
    local_288._0_8_ = (void *)0xc43a39b453aa8c77;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x22877a49094d7767;
    local_338._16_8_ = (void *)0x0;
    local_338._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    local_338._0_8_ = 0;
    local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_1f8 = 0xa0b4d0e9a0cb7f89;
    uStack_1f0 = 0x6723f249d2cf9468;
    local_228._32_8_ = 0xe7070817e3d35e58;
    uStack_200 = 0x237b4cc50f723bc0;
    local_228._16_8_ = (void *)0x6fbea8bf5d1e3203;
    local_228._24_8_ = 0xa879ca3e16351609;
    local_228._0_8_ = 0x345a55d8b0123b40;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
    local_168._80_8_ = 0x9999999999999999;
    local_168._88_8_ = 0x9999999999999999;
    local_168._64_8_ = 0x9999999999999999;
    local_168._72_8_ = 0x9999999999999999;
    local_168._48_8_ = 0x9999999999999999;
    local_168._56_8_ = 0x9999999999999999;
    local_168._32_8_ = 0x9999999999999999;
    local_168._40_8_ = 0x9999999999999999;
    local_168._16_8_ = (void *)0x9999999999999999;
    local_168._24_8_ = 0x9999999999999999;
    local_168._0_8_ = (void *)0x9999999999999999;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x9999999999999999;
    local_168[0x60] = 0x99;
    local_168[0x61] = 0x99;
    local_168[0x62] = 0x99;
    local_168[99] = 0x99;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151d67;
    test_schnorrsig_bip_vectors_check_signing(local_398,local_288,local_338,local_168,100,local_228)
    ;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151d80;
    test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,local_228,1);
    if (COUNT < 1) break;
    keypair = (secp256k1_schnorrsig_extraparams *)local_288;
    while( true ) {
      psVar182 = (secp256k1_schnorrsig_extraparams *)local_168;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      psVar157 = (secp256k1_context *)(local_338 + 0x80);
      unaff_RBP = nonce_function_bip340;
      local_2e8 = 0x6e68637320612072;
      uStack_2e0 = 0x2e2e67697372726f;
      local_338._64_8_ = 0x2073692073696874;
      uStack_2f0 = 0x6f662067736d2061;
      local_338._48_8_ = 0;
      local_338._56_8_ = 0;
      local_338._32_8_ = (void *)0x0;
      local_338._40_8_ = 0;
      local_338._16_8_ = (void *)0x0;
      local_338._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
      local_338._0_8_ = 0;
      local_338._8_8_ = (secp256k1_nonce_function_hardened)0x0;
      local_3d8._16_8_ = (undefined1 *)0x0;
      local_3d8._0_8_ = 0x8cb36fda;
      local_3d8._8_8_ = (code *)0x0;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151e07;
      testrand256((uchar *)psVar157);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151e14;
      testrand256(local_338 + 0x60);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151e26;
      iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar182,(uchar *)psVar157);
      if (iVar153 == 0) break;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151e42;
      iVar153 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                           (secp256k1_keypair *)psVar182);
      r = (code *)psVar182;
      if (iVar153 == 0) goto LAB_00152908;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
      r = (code *)(local_338 + 0x40);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151e7c;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar182,
                           nonce_function_bip340,(void *)0x0);
      if (iVar153 == 0) goto LAB_0015290d;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151e9e;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_xonly_pubkey *)pubkey);
      psVar182 = (secp256k1_schnorrsig_extraparams *)r;
      if (iVar153 == 0) goto LAB_00152912;
      psVar182 = (secp256k1_schnorrsig_extraparams *)local_168;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151ed6;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)r,0x20,(secp256k1_keypair *)psVar182,
                           nonce_function_bip340,(void *)0x0);
      if (iVar153 == 0) goto LAB_00152917;
      lVar164 = 0;
      psVar157 = (secp256k1_context *)local_3d8;
      do {
        iVar153 = (uint)(byte)local_398[lVar164] - (uint)(byte)local_288[lVar164];
        if (local_398[lVar164] != local_288[lVar164]) goto LAB_00151f0b;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x40);
      iVar153 = 0;
LAB_00151f0b:
      psVar186 = (secp256k1_schnorrsig_extraparams *)r;
      if (iVar153 != 0) goto LAB_0015291c;
      psVar186 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151f38;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)psVar186,(uchar *)r,0x20,(secp256k1_keypair *)psVar182,
                           (secp256k1_schnorrsig_extraparams *)psVar157);
      if (iVar153 == 0) goto LAB_00152921;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151f5a;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)psVar186,(uchar *)r,0x20,(secp256k1_xonly_pubkey *)pubkey);
      if (iVar153 == 0) goto LAB_00152926;
      local_368 = 0x101010101010101;
      sStack_360 = 0x101010101010101;
      local_378 = (secp256k1_context *)0x101010101010101;
      uStack_370 = 0x101010101010101;
      local_388 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_failing;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x151fb9;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)psVar186,(uchar *)r,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_schnorrsig_extraparams *)psVar157);
      psVar182 = (secp256k1_schnorrsig_extraparams *)r;
      if (iVar153 != 0) goto LAB_0015292b;
      lVar164 = 0;
      psVar182 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        iVar153 = (uint)(byte)local_398[lVar164] - (uint)(byte)local_338[lVar164];
        if (local_398[lVar164] != local_338[lVar164]) goto LAB_00151ff4;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x40);
      iVar153 = 0;
LAB_00151ff4:
      if (iVar153 != 0) goto LAB_00152930;
      local_368 = 0x101010101010101;
      sStack_360 = 0x101010101010101;
      local_378 = (secp256k1_context *)0x101010101010101;
      uStack_370 = 0x101010101010101;
      local_388 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_0;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152050;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)r,0x20,(secp256k1_keypair *)psVar182,
                           (secp256k1_schnorrsig_extraparams *)psVar157);
      if (iVar153 != 0) goto LAB_00152935;
      lVar164 = 0;
      do {
        iVar153 = (uint)(byte)local_398[lVar164] - (uint)(byte)local_338[lVar164];
        if (local_398[lVar164] != local_338[lVar164]) goto LAB_00152080;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x40);
      iVar153 = 0;
LAB_00152080:
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)r;
      if (iVar153 != 0) goto LAB_0015293a;
      local_368 = 0x101010101010101;
      sStack_360 = 0x101010101010101;
      local_378 = (secp256k1_context *)0x101010101010101;
      uStack_370 = 0x101010101010101;
      local_388 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_overflowing;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1520e2;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar182,
                           (secp256k1_schnorrsig_extraparams *)psVar157);
      if (iVar153 == 0) goto LAB_0015293f;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152104;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_xonly_pubkey *)pubkey);
      psVar168 = psVar157;
      if (iVar153 == 0) goto LAB_00152944;
      local_3d8._8_8_ = (code *)0x0;
      local_3d8._16_8_ = local_338 + 0x60;
      psVar168 = (secp256k1_context *)local_168;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152147;
      iVar153 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)r,0x20,(secp256k1_keypair *)psVar168,
                           (secp256k1_schnorrsig_extraparams *)psVar157);
      if (iVar153 == 0) goto LAB_00152949;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152178;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)r,0x20,(secp256k1_keypair *)psVar168,
                           nonce_function_bip340,(void *)local_3d8._16_8_);
      pubkey_00 = keypair;
      if (iVar153 == 0) goto LAB_0015294e;
      lVar164 = 0;
      psVar168 = (secp256k1_context *)local_338;
      do {
        iVar153 = (uint)(byte)local_398[lVar164] - (uint)(byte)local_288[lVar164];
        if (local_398[lVar164] != local_288[lVar164]) goto LAB_001521b0;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x40);
      iVar153 = 0;
LAB_001521b0:
      r = (code *)(local_338 + 0x80);
      if (iVar153 != 0) goto LAB_00152953;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1521c8;
      testrand256((uchar *)r);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1521da;
      iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,(uchar *)r);
      if (iVar153 == 0) goto LAB_00152958;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1521f6;
      iVar153 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)psVar168,(int *)0x0,
                           (secp256k1_keypair *)keypair);
      if (iVar153 == 0) goto LAB_0015295d;
      psVar182 = (secp256k1_schnorrsig_extraparams *)0x0;
      pubkey_00 = pubkey;
      do {
        pubkey = (secp256k1_schnorrsig_extraparams *)(local_398 + (long)psVar182);
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152214;
        testrand256((uchar *)pubkey);
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152239;
        iVar153 = secp256k1_schnorrsig_sign_internal
                            (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,(secp256k1_keypair *)keypair,
                             nonce_function_bip340,(void *)0x0);
        if (iVar153 == 0) {
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1528ea;
          run_schnorrsig_tests_cold_66();
LAB_001528ea:
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1528ef;
          run_schnorrsig_tests_cold_65();
LAB_001528ef:
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1528f4;
          run_schnorrsig_tests_cold_97();
LAB_001528f4:
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1528f9;
          run_schnorrsig_tests_cold_96();
LAB_001528f9:
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1528fe;
          run_schnorrsig_tests_cold_95();
          psVar157 = psVar168;
LAB_001528fe:
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152903;
          run_schnorrsig_tests_cold_94();
          goto LAB_00152903;
        }
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15225b;
        iVar153 = secp256k1_schnorrsig_verify
                            (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,
                             (secp256k1_xonly_pubkey *)psVar168);
        if (iVar153 == 0) goto LAB_001528ea;
        psVar182 = (secp256k1_schnorrsig_extraparams *)&psVar182[1].noncefp;
        pubkey_00 = (secp256k1_schnorrsig_extraparams *)&pubkey_00[2].ndata;
      } while (psVar182 != (secp256k1_schnorrsig_extraparams *)0x60);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15227b;
      uVar154 = testrand_int(3);
      uVar183 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar173 = secp256k1_test_state[1] << 0x11;
      uVar175 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar165 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar175;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar165;
      secp256k1_test_state[2] = uVar175 ^ uVar173;
      secp256k1_test_state[3] = uVar165 << 0x2d | uVar165 >> 0x13;
      r = (code *)(uVar183 >> 0x3b);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1522e8;
      uVar155 = testrand_int(0xfe);
      pubkey = (secp256k1_schnorrsig_extraparams *)(local_228 + (ulong)uVar154 * 0x40);
      bVar188 = (char)uVar155 + 1;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(ulong)CONCAT31((int3)(uVar155 >> 8),bVar188);
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)r)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)r)->magic] ^ bVar188;
      unaff_RBP = (code *)(local_398 + (ulong)uVar154 * 0x20);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15232a;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 != 0) goto LAB_00152962;
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)r)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)r)->magic] ^ bVar188;
      uVar183 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar173 = secp256k1_test_state[1] << 0x11;
      uVar175 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar165 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar175;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar165;
      secp256k1_test_state[2] = uVar175 ^ uVar173;
      secp256k1_test_state[3] = uVar165 << 0x2d | uVar165 >> 0x13;
      r = (code *)(uVar183 >> 0x3b);
      pbVar1 = (byte *)((long)&((secp256k1_schnorrsig_extraparams *)((long)r + 0x18))->noncefp +
                       (long)pubkey);
      *pbVar1 = *pbVar1 ^ bVar188;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1523b9;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 != 0) goto LAB_00152967;
      (((secp256k1_schnorrsig_extraparams *)r)->magic + (long)pubkey->magic)[0x20] =
           (((secp256k1_schnorrsig_extraparams *)r)->magic + (long)pubkey->magic)[0x20] ^ bVar188;
      uVar183 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar173 = secp256k1_test_state[1] << 0x11;
      uVar175 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar165 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar175;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar165;
      secp256k1_test_state[2] = uVar175 ^ uVar173;
      secp256k1_test_state[3] = uVar165 << 0x2d | uVar165 >> 0x13;
      r = (code *)(uVar183 >> 0x3b);
      ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
      [(long)((secp256k1_schnorrsig_extraparams *)r)->magic] =
           ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
           [(long)((secp256k1_schnorrsig_extraparams *)r)->magic] ^ bVar188;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15244c;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 != 0) goto LAB_0015296c;
      r = (code *)(((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic +
                  (long)((secp256k1_schnorrsig_extraparams *)r)->magic);
      ((secp256k1_schnorrsig_extraparams *)r)->magic[0] =
           ((secp256k1_schnorrsig_extraparams *)r)->magic[0] ^ bVar188;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152475;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 == 0) goto LAB_00152971;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      unaff_RBP = (code *)local_398;
      r = nonce_function_bip340;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1524b6;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar153 == 0) goto LAB_00152976;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1524d8;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 == 0) goto LAB_0015297b;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(local_228 + 0x20);
      local_1f8 = 0xffffffffffffffff;
      uStack_1f0 = 0xffffffffffffffff;
      local_228._32_8_ = 0xffffffffffffffff;
      uStack_200 = 0xffffffffffffffff;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152511;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 != 0) goto LAB_00152980;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15253e;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar153 == 0) goto LAB_00152985;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152560;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 == 0) goto LAB_0015298a;
      r = (code *)(local_338 + 0x40);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15257d;
      secp256k1_scalar_set_b32((secp256k1_scalar *)r,(uchar *)pubkey_00,(int *)0x0);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152588;
      secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152593;
      secp256k1_scalar_get_b32((uchar *)pubkey_00,(secp256k1_scalar *)r);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1525ad;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar168);
      psVar186 = keypair;
      if (iVar153 != 0) goto LAB_0015298f;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1525d9;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_keypair *)keypair,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar153 == 0) goto LAB_00152994;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1525f7;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar168);
      if (iVar153 == 0) goto LAB_00152999;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152609;
      uVar154 = testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar154;
      uVar165 = 0xffffffffffffffe0;
      psVar168 = (secp256k1_context *)local_168;
      do {
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152627;
        testrand256(local_168 + uVar165 + 0x20);
        uVar165 = uVar165 + 0x20;
      } while (uVar165 < 0xe0);
      psVar182 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar154;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15265a;
      iVar153 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)psVar168,(size_t)psVar182,
                           (secp256k1_keypair *)keypair,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      pubkey_00 = psVar182;
      if (iVar153 == 0) goto LAB_0015299e;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_338;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152682;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar168,(size_t)psVar182,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar153 == 0) goto LAB_001529a3;
      unaff_RBP = (code *)(ulong)(uVar154 - 1);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1526a5;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar168,(ulong)unaff_RBP & 0xff,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar153 != 0) goto LAB_001529a8;
      uVar167 = (int)local_2b8._40_8_ + 1;
      local_2b8._40_8_ = ZEXT48(uVar167);
      unaff_RBP = nonce_function_bip340;
      if (COUNT <= (int)uVar167) goto LAB_001526e2;
    }
LAB_00152903:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152908;
    run_schnorrsig_tests_cold_79();
    r = (code *)psVar182;
LAB_00152908:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15290d;
    run_schnorrsig_tests_cold_78();
LAB_0015290d:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152912;
    run_schnorrsig_tests_cold_77();
    psVar182 = (secp256k1_schnorrsig_extraparams *)r;
LAB_00152912:
    r = (code *)pubkey_00;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152917;
    run_schnorrsig_tests_cold_76();
LAB_00152917:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15291c;
    run_schnorrsig_tests_cold_75();
    psVar186 = (secp256k1_schnorrsig_extraparams *)r;
LAB_0015291c:
    r = (code *)psVar182;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152921;
    run_schnorrsig_tests_cold_32();
LAB_00152921:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152926;
    run_schnorrsig_tests_cold_74();
LAB_00152926:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15292b;
    run_schnorrsig_tests_cold_73();
    psVar182 = (secp256k1_schnorrsig_extraparams *)r;
LAB_0015292b:
    r = (code *)psVar186;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152930;
    run_schnorrsig_tests_cold_33();
LAB_00152930:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152935;
    run_schnorrsig_tests_cold_34();
LAB_00152935:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15293a;
    run_schnorrsig_tests_cold_35();
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)r;
LAB_0015293a:
    r = (code *)psVar182;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15293f;
    run_schnorrsig_tests_cold_36();
LAB_0015293f:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152944;
    run_schnorrsig_tests_cold_72();
    psVar168 = psVar157;
LAB_00152944:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152949;
    run_schnorrsig_tests_cold_71();
LAB_00152949:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15294e;
    run_schnorrsig_tests_cold_70();
LAB_0015294e:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152953;
    run_schnorrsig_tests_cold_69();
LAB_00152953:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152958;
    run_schnorrsig_tests_cold_37();
LAB_00152958:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15295d;
    run_schnorrsig_tests_cold_68();
LAB_0015295d:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152962;
    run_schnorrsig_tests_cold_67();
LAB_00152962:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152967;
    run_schnorrsig_tests_cold_38();
LAB_00152967:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15296c;
    run_schnorrsig_tests_cold_39();
LAB_0015296c:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152971;
    run_schnorrsig_tests_cold_40();
LAB_00152971:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152976;
    run_schnorrsig_tests_cold_64();
LAB_00152976:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15297b;
    run_schnorrsig_tests_cold_63();
LAB_0015297b:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152980;
    run_schnorrsig_tests_cold_62();
LAB_00152980:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152985;
    run_schnorrsig_tests_cold_41();
LAB_00152985:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15298a;
    run_schnorrsig_tests_cold_61();
LAB_0015298a:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15298f;
    run_schnorrsig_tests_cold_60();
    psVar186 = keypair;
LAB_0015298f:
    keypair = (secp256k1_schnorrsig_extraparams *)r;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152994;
    run_schnorrsig_tests_cold_42();
LAB_00152994:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152999;
    run_schnorrsig_tests_cold_59();
LAB_00152999:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15299e;
    run_schnorrsig_tests_cold_58();
LAB_0015299e:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529a3;
    run_schnorrsig_tests_cold_57();
LAB_001529a3:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529a8;
    run_schnorrsig_tests_cold_56();
LAB_001529a8:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529ad;
    run_schnorrsig_tests_cold_43();
LAB_001529ad:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529b2;
    run_schnorrsig_tests_cold_99();
    psVar182 = keypair;
    keypair = psVar186;
LAB_001529b2:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529b7;
    run_schnorrsig_tests_cold_98();
LAB_001529b7:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529bc;
    run_schnorrsig_tests_cold_93();
LAB_001529bc:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529c1;
    run_schnorrsig_tests_cold_92();
LAB_001529c1:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529c6;
    run_schnorrsig_tests_cold_1();
LAB_001529c6:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529cb;
    run_schnorrsig_tests_cold_91();
LAB_001529cb:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529d0;
    run_schnorrsig_tests_cold_90();
LAB_001529d0:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529d5;
    run_schnorrsig_tests_cold_89();
LAB_001529d5:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529da;
    run_schnorrsig_tests_cold_88();
LAB_001529da:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529df;
    run_schnorrsig_tests_cold_87();
LAB_001529df:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529e4;
    run_schnorrsig_tests_cold_86();
LAB_001529e4:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529e9;
    run_schnorrsig_tests_cold_85();
    psVar157 = extraout_RAX;
LAB_001529e9:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1529fd;
    (*(psVar157->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar157->illegal_callback).data);
  } while( true );
LAB_001526e2:
  psVar182 = (secp256k1_schnorrsig_extraparams *)local_168;
  pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
  psVar168 = (secp256k1_context *)local_338;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1526f2;
  testrand256((uchar *)psVar168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152709;
  iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)psVar168);
  if (iVar153 == 0) {
LAB_00152c0f:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c14;
    run_schnorrsig_tests_cold_55();
LAB_00152c14:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c19;
    run_schnorrsig_tests_cold_54();
LAB_00152c19:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c1e;
    run_schnorrsig_tests_cold_53();
LAB_00152c1e:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c23;
    run_schnorrsig_tests_cold_44();
LAB_00152c23:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c28;
    run_schnorrsig_tests_cold_52();
LAB_00152c28:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c2d;
    run_schnorrsig_tests_cold_51();
LAB_00152c2d:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c32;
    run_schnorrsig_tests_cold_50();
LAB_00152c32:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c37;
    run_schnorrsig_tests_cold_49();
LAB_00152c37:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c3c;
    run_schnorrsig_tests_cold_48();
LAB_00152c3c:
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c41;
    run_schnorrsig_tests_cold_47();
  }
  else {
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15272f;
    iVar153 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                         (secp256k1_keypair *)local_168);
    if (iVar153 == 0) goto LAB_00152c14;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152753;
    iVar153 = secp256k1_xonly_pubkey_serialize
                        (CTX,local_338 + 0x60,(secp256k1_xonly_pubkey *)local_228);
    if (iVar153 == 0) goto LAB_00152c19;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152777;
    iVar153 = secp256k1_keypair_xonly_tweak_add(CTX,(secp256k1_keypair *)local_168,local_338 + 0x60)
    ;
    if (iVar153 != 1) goto LAB_00152c1e;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15279e;
    iVar153 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)local_398,(int *)&local_3b8,
                         (secp256k1_keypair *)local_168);
    if (iVar153 == 0) goto LAB_00152c23;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1527bf;
    iVar153 = secp256k1_xonly_pubkey_serialize
                        (CTX,local_338 + 0x40,(secp256k1_xonly_pubkey *)local_398);
    if (iVar153 == 0) goto LAB_00152c28;
    psVar168 = (secp256k1_context *)local_3d8;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1527d4;
    testrand256((uchar *)psVar168);
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152807;
    iVar153 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_288,(uchar *)psVar168,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    if (iVar153 == 0) goto LAB_00152c2d;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152828;
    iVar153 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_398,local_338 + 0x40)
    ;
    if (iVar153 == 0) goto LAB_00152c32;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152853;
    iVar153 = secp256k1_schnorrsig_verify
                        (CTX,local_288,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_398);
    if (iVar153 == 0) goto LAB_00152c37;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152877;
    iVar153 = secp256k1_xonly_pubkey_serialize
                        (CTX,local_338 + 0x80,(secp256k1_xonly_pubkey *)local_228);
    if (iVar153 == 0) goto LAB_00152c3c;
    psStack_410 = (secp256k1_schnorrsig_extraparams *)0x15289b;
    iVar153 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_228,local_338 + 0x80)
    ;
    if (iVar153 != 0) {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1528cb;
      iVar153 = secp256k1_xonly_pubkey_tweak_add_check
                          (CTX,local_338 + 0x40,(int)local_3b8.magic,
                           (secp256k1_xonly_pubkey *)local_228,local_338 + 0x60);
      if (iVar153 != 0) {
        return;
      }
      goto LAB_00152c46;
    }
  }
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x152c46;
  run_schnorrsig_tests_cold_46();
LAB_00152c46:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)run_musig_tests;
  run_schnorrsig_tests_cold_45();
  auStack_4c0._136_8_ = psVar168;
  psStack_430 = pubkey;
  psStack_428 = psVar182;
  psStack_420 = keypair;
  psStack_418 = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)unaff_RBP;
  if (0 < COUNT) {
    uVar165 = 0;
    do {
      sha2 = (musig_sign_verify_vector *)auStack_a20;
      pmStackY_dd8 = (musig_tweak_vector *)0x152c8b;
      uStack_d48 = uVar165;
      testrand256(auStack_a20 + 0xc0);
      keyagg_cache = (musig_nonce_agg_vector *)auStack_be0;
      psVar158 = asStack_d90;
      pmVar184 = (musig_sign_verify_vector *)0x0;
      keyagg_cache_01 = (musig_key_agg_vector *)0x0;
      keyagg_cache_00 = (musig_sign_verify_vector *)0x0;
      do {
        aggnonce = (musig_sign_verify_vector *)(auStack_c20 + (long)keyagg_cache_01);
        pmStackY_dd8 = (musig_tweak_vector *)0x152cbc;
        testrand256((uchar *)aggnonce);
        *(musig_nonce_agg_vector **)(auStack_b60 + (long)pmVar184 + 0xe0) = keyagg_cache;
        pubnonce = (secp256k1_musig_pubnonce *)(auStack_940 + (long)keyagg_cache_00);
        *(secp256k1_musig_pubnonce **)(auStack_b60 + (long)pmVar184 + 0xf0) = pubnonce;
        *(secp256k1_musig_partial_sig **)(auStack_b60 + (long)pmVar184 + 0xd0) = psVar158;
        pmStackY_dd8 = (musig_tweak_vector *)0x152d03;
        iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)auStack_b60,(uchar *)aggnonce);
        *(undefined8 *)(auStack_be0 + (long)pmVar184 * 8) = auStack_b60._32_8_;
        *(uchar (*) [8])(auStack_be0 + (long)pmVar184 * 8 + 8) = auStack_b38;
        *(uchar (*) [8])(auStack_be0 + (long)pmVar184 * 8 + 0x10) = auStack_b30;
        *(uchar (*) [8])(auStack_be0 + (long)pmVar184 * 8 + 0x18) = auStack_b28;
        *(uchar (*) [8])(auStack_be0 + (long)pmVar184 * 8 + 0x20) = auStack_b20;
        *(uchar (*) [8])(auStack_be0 + (long)pmVar184 * 8 + 0x28) = auStack_b18;
        *(uchar (*) [8])(auStack_be0 + (long)pmVar184 * 8 + 0x30) = auStack_b10;
        *(undefined8 *)(auStack_be0 + (long)pmVar184 * 8 + 0x38) = auStack_b08._0_8_;
        pmStackY_dd8 = (musig_tweak_vector *)0x152d52;
        pmVar176 = sha2;
        memcpy(sha2,(secp256k1_keypair *)auStack_b60,0x60);
        if (iVar153 == 0) {
          pmStackY_dd8 = (musig_tweak_vector *)0x153f5f;
          run_musig_tests_cold_99();
          goto LAB_00153f5f;
        }
        if (pmVar184 == (musig_sign_verify_vector *)0x0) {
          pmStackY_dd8 = (musig_tweak_vector *)0x152db8;
          testrand256(auStack_4c0 + 0x20 +
                      (long)((musig_sign_verify_vector *)keyagg_cache_01)->pubkeys[0]);
          pmStackY_dd8 = (musig_tweak_vector *)0x152df2;
          iVar153 = secp256k1_musig_nonce_gen
                              (CTX,(secp256k1_musig_secnonce *)(auStack_700 + (long)keyagg_cache_00)
                               ,pubnonce,
                               auStack_4c0 + 0x20 +
                               (long)((musig_sign_verify_vector *)keyagg_cache_01)->pubkeys[0],
                               (uchar *)aggnonce,(secp256k1_pubkey *)keyagg_cache,(uchar *)0x0,
                               (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
          cache_i = (musig_tweak_vector *)0x0;
          if (iVar153 != 1) goto LAB_00154788;
        }
        else {
          pmStackY_dd8 = (musig_tweak_vector *)0x152d8b;
          pmVar176 = (musig_sign_verify_vector *)CTX;
          iVar153 = secp256k1_musig_nonce_gen_counter
                              (CTX,(secp256k1_musig_secnonce *)(auStack_700 + (long)keyagg_cache_00)
                               ,pubnonce,0,(secp256k1_keypair *)sha2,(uchar *)0x0,
                               (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
          if (iVar153 == 0) goto LAB_00153f73;
        }
        keyagg_cache_00 = (musig_sign_verify_vector *)(keyagg_cache_00->pubkeys[3] + 1);
        keyagg_cache_01 =
             (musig_key_agg_vector *)
             ((((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_01)->sk)->
              scalar_offset).d + 3);
        pmVar184 = (musig_sign_verify_vector *)((long)pmVar184 + 8);
        sha2 = (musig_sign_verify_vector *)(sha2->pubkeys[1] + 0x1f);
        psVar158 = psVar158 + 1;
        keyagg_cache = (musig_nonce_agg_vector *)
                       ((long)*(uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk + 0x40);
      } while (pmVar184 == (musig_sign_verify_vector *)0x8);
      sha2 = (musig_sign_verify_vector *)auStack_b60;
      pmStackY_dd8 = (musig_tweak_vector *)0x152e52;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_pubkey_agg
                          (CTX,(secp256k1_xonly_pubkey *)auStack_a60,
                           (secp256k1_musig_keyagg_cache *)sha2,
                           (secp256k1_pubkey **)(auStack_b60 + 0xe0),2);
      if (iVar153 == 0) goto LAB_00154bfb;
      aggnonce = (musig_sign_verify_vector *)&sStack_d40;
      pmStackY_dd8 = (musig_tweak_vector *)0x152e7e;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_nonce_agg
                          (CTX,(secp256k1_musig_aggnonce *)aggnonce,
                           (secp256k1_musig_pubnonce **)(auStack_b60 + 0xf0),2);
      if (iVar153 == 0) goto LAB_00154c00;
      pmStackY_dd8 = (musig_tweak_vector *)0x152ea8;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_nonce_process
                          (CTX,(secp256k1_musig_session *)auStack_cb0,
                           (secp256k1_musig_aggnonce *)aggnonce,auStack_a20 + 0xc0,
                           (secp256k1_musig_keyagg_cache *)sha2);
      pmVar171 = keyagg_cache_00;
      cache_i = (musig_tweak_vector *)pmVar184;
      if (iVar153 == 0) goto LAB_00154c05;
      sha2 = (musig_sign_verify_vector *)asStack_d90;
      aggnonce = (musig_sign_verify_vector *)auStack_a20;
      pmVar171 = (musig_sign_verify_vector *)auStack_be0;
      keyagg_cache_01 = (musig_key_agg_vector *)0x0;
      do {
        keyagg_cache = (musig_nonce_agg_vector *)auStack_b60;
        cache_i = (musig_tweak_vector *)auStack_cb0;
        pmStackY_dd8 = (musig_tweak_vector *)0x152efb;
        pmVar176 = (musig_sign_verify_vector *)CTX;
        iVar153 = secp256k1_musig_partial_sign
                            (CTX,(secp256k1_musig_partial_sig *)sha2,
                             (secp256k1_musig_secnonce *)(auStack_700 + (long)keyagg_cache_01),
                             (secp256k1_keypair *)aggnonce,
                             (secp256k1_musig_keyagg_cache *)keyagg_cache,
                             (secp256k1_musig_session *)cache_i);
        if (iVar153 == 0) goto LAB_00153f5f;
        pmStackY_dd8 = (musig_tweak_vector *)0x152f26;
        pmVar176 = (musig_sign_verify_vector *)CTX;
        iVar153 = secp256k1_musig_partial_sig_verify
                            (CTX,(secp256k1_musig_partial_sig *)sha2,
                             (secp256k1_musig_pubnonce *)(auStack_940 + (long)keyagg_cache_01),
                             (secp256k1_pubkey *)pmVar171,
                             (secp256k1_musig_keyagg_cache *)keyagg_cache,
                             (secp256k1_musig_session *)cache_i);
        if (iVar153 != 1) goto LAB_00153f64;
        keyagg_cache_01 = (musig_key_agg_vector *)((long)keyagg_cache_01 + 0x84);
        pmVar171 = (musig_sign_verify_vector *)
                   ((((secp256k1_ecmult_gen_context *)pmVar171->sk)->ge_offset).x.n + 3);
        aggnonce = (musig_sign_verify_vector *)((long)aggnonce + 0x60);
        sha2 = (musig_sign_verify_vector *)
               ((long)(((secp256k1_ecmult_gen_context *)sha2->sk)->scalar_offset).d + 0x1c);
      } while (keyagg_cache_01 == (musig_key_agg_vector *)0x84);
      sha2 = (musig_sign_verify_vector *)auStack_4c0;
      pmStackY_dd8 = (musig_tweak_vector *)0x152f75;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_partial_sig_agg
                          (CTX,(uchar *)sha2,(secp256k1_musig_session *)auStack_cb0,
                           (secp256k1_musig_partial_sig **)(auStack_b60 + 0xd0),2);
      if (iVar153 != 1) goto LAB_00154c14;
      aggnonce = (musig_sign_verify_vector *)(auStack_a20 + 0xc0);
      pmStackY_dd8 = (musig_tweak_vector *)0x152fa5;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)sha2,(uchar *)aggnonce,0x20,
                           (secp256k1_xonly_pubkey *)auStack_a60);
      if (iVar153 == 0) goto LAB_00154c19;
      uVar167 = (int)uStack_d48 + 1;
      uVar165 = (ulong)uVar167;
    } while ((int)uVar167 < COUNT);
  }
  pmStackY_dd8 = (musig_tweak_vector *)0x152fd0;
  musig_api_tests();
  pmStackY_dd8 = (musig_tweak_vector *)0x152fdd;
  testrand_bytes_test(auStack_a20,0x20);
  pmStackY_dd8 = (musig_tweak_vector *)0x152ff2;
  testrand_bytes_test(auStack_cb0,0x20);
  pmStackY_dd8 = (musig_tweak_vector *)0x153007;
  testrand_bytes_test(auStack_b60,0x21);
  pmStackY_dd8 = (musig_tweak_vector *)0x15301c;
  testrand_bytes_test(sStack_d40.data,0x20);
  pmStackY_dd8 = (musig_tweak_vector *)0x153031;
  testrand_bytes_test(auStack_be0,0x20);
  pmStackY_dd8 = (musig_tweak_vector *)0x153043;
  testrand_bytes_test(asStack_d90[0].data,0x20);
  auStack_700 = (undefined1  [8])auStack_a20;
  psStack_6f8 = &sStack_d40;
  puStack_6f0 = auStack_cb0;
  puStack_6e8 = auStack_b60;
  puStack_6e0 = auStack_be0;
  psStack_6d8 = asStack_d90;
  if (0 < COUNT) {
    iVar153 = 0;
    do {
      pmStackY_dd8 = (musig_tweak_vector *)0x15309a;
      musig_nonce_bitflip((uchar **)auStack_700,0,0x20);
      pmStackY_dd8 = (musig_tweak_vector *)0x1530ac;
      musig_nonce_bitflip((uchar **)auStack_700,1,0x20);
      pmStackY_dd8 = (musig_tweak_vector *)0x1530be;
      musig_nonce_bitflip((uchar **)auStack_700,2,0x20);
      pmStackY_dd8 = (musig_tweak_vector *)0x1530d0;
      musig_nonce_bitflip((uchar **)auStack_700,3,0x21);
      pmStackY_dd8 = (musig_tweak_vector *)0x1530e2;
      musig_nonce_bitflip((uchar **)auStack_700,4,0x20);
      pmStackY_dd8 = (musig_tweak_vector *)0x1530f4;
      musig_nonce_bitflip((uchar **)auStack_700,5,0x20);
      iVar153 = iVar153 + 1;
    } while (iVar153 < COUNT);
  }
  keyagg_cache = (musig_nonce_agg_vector *)auStack_a20;
  sStack_d40.data[0x10] = auStack_a20[0x10];
  sStack_d40.data[0x11] = auStack_a20[0x11];
  sStack_d40.data[0x12] = auStack_a20[0x12];
  sStack_d40.data[0x13] = auStack_a20[0x13];
  sStack_d40.data[0x14] = auStack_a20[0x14];
  sStack_d40.data[0x15] = auStack_a20[0x15];
  sStack_d40.data[0x16] = auStack_a20[0x16];
  sStack_d40.data[0x17] = auStack_a20[0x17];
  sStack_d40.data[0x18] = auStack_a20[0x18];
  sStack_d40.data[0x19] = auStack_a20[0x19];
  sStack_d40.data[0x1a] = auStack_a20[0x1a];
  sStack_d40.data[0x1b] = auStack_a20[0x1b];
  sStack_d40.data[0x1c] = auStack_a20[0x1c];
  sStack_d40.data[0x1d] = auStack_a20[0x1d];
  sStack_d40.data[0x1e] = auStack_a20[0x1e];
  sStack_d40.data[0x1f] = auStack_a20[0x1f];
  sStack_d40.data[0] = auStack_a20[0];
  sStack_d40.data[1] = auStack_a20[1];
  sStack_d40.data[2] = auStack_a20[2];
  sStack_d40.data[3] = auStack_a20[3];
  sStack_d40.data[4] = auStack_a20[4];
  sStack_d40.data[5] = auStack_a20[5];
  sStack_d40.data[6] = auStack_a20[6];
  sStack_d40.data[7] = auStack_a20[7];
  sStack_d40.data[8] = auStack_a20[8];
  sStack_d40.data[9] = auStack_a20[9];
  sStack_d40.data[10] = auStack_a20[10];
  sStack_d40.data[0xb] = auStack_a20[0xb];
  sStack_d40.data[0xc] = auStack_a20[0xc];
  sStack_d40.data[0xd] = auStack_a20[0xd];
  sStack_d40.data[0xe] = auStack_a20[0xe];
  sStack_d40.data[0xf] = auStack_a20[0xf];
  auStack_cb0._0_8_ = auStack_a20._0_8_;
  auStack_cb0._8_8_ = auStack_a20._8_8_;
  auStack_cb0._16_8_ = auStack_a20._16_8_;
  auStack_cb0._24_8_ = auStack_a20._24_8_;
  auStack_b60._0_8_ = auStack_a20._0_8_;
  auStack_b60._8_8_ = auStack_a20._8_8_;
  auStack_b60._16_8_ = auStack_a20._16_8_;
  auStack_b60._24_8_ = auStack_a20._24_8_;
  pmVar184 = (musig_sign_verify_vector *)auStack_be0;
  auStack_be0._0_8_ = auStack_a20._0_8_;
  auStack_be0._8_8_ = auStack_a20._8_8_;
  auStack_be0._16_8_ = auStack_a20._16_8_;
  auStack_be0._24_8_ = auStack_a20._24_8_;
  asStack_d90[0].data._0_4_ = (undefined4)auStack_a20._0_8_;
  asStack_d90[0].data._4_4_ = SUB84(auStack_a20._0_8_,4);
  asStack_d90[0].data._8_4_ = (undefined4)auStack_a20._8_8_;
  asStack_d90[0].data._12_4_ = SUB84(auStack_a20._8_8_,4);
  asStack_d90[0].data._16_4_ = (undefined4)auStack_a20._16_8_;
  asStack_d90[0].data._20_4_ = SUB84(auStack_a20._16_8_,4);
  asStack_d90[0].data._24_4_ = (undefined4)auStack_a20._24_8_;
  asStack_d90[0].data._28_4_ = SUB84(auStack_a20._24_8_,4);
  pmStackY_dd8 = (musig_tweak_vector *)0x153182;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)auStack_940,(uchar *)keyagg_cache,sStack_d40.data,auStack_cb0,
             auStack_b60,(uchar *)pmVar184,asStack_d90[0].data);
  keyagg_cache_01 = (musig_key_agg_vector *)0x0;
  pmStackY_dd8 = (musig_tweak_vector *)0x1531a4;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)auStack_900,(uchar *)keyagg_cache,(uchar *)0x0,auStack_cb0,
             auStack_b60,(uchar *)pmVar184,asStack_d90[0].data);
  pmStackY_dd8 = (musig_tweak_vector *)0x1531c8;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_900 + 0x40),(uchar *)keyagg_cache,sStack_d40.data,
             (uchar *)0x0,auStack_b60,(uchar *)pmVar184,asStack_d90[0].data);
  pmStackY_dd8 = (musig_tweak_vector *)0x1531ed;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_900 + 0x80),(uchar *)keyagg_cache,sStack_d40.data,
             auStack_cb0,(uchar *)0x0,(uchar *)pmVar184,asStack_d90[0].data);
  pmStackY_dd8 = (musig_tweak_vector *)0x153215;
  secp256k1_nonce_function_musig
            (asStack_840,(uchar *)keyagg_cache,sStack_d40.data,auStack_cb0,auStack_b60,(uchar *)0x0,
             asStack_d90[0].data);
  pmStackY_dd8 = (musig_tweak_vector *)0x153239;
  secp256k1_nonce_function_musig
            (asStack_800,(uchar *)keyagg_cache,sStack_d40.data,auStack_cb0,auStack_b60,
             (uchar *)pmVar184,(uchar *)0x0);
  lVar164 = 5;
  puVar166 = (undefined8 *)(auStack_900 + 0x38);
  do {
    lVar169 = (long)keyagg_cache_01 * 0x40;
    pmVar176 = *(musig_sign_verify_vector **)(auStack_940 + lVar169 + 0x20);
    sha2 = *(musig_sign_verify_vector **)(auStack_900 + lVar169 + -8);
    aggnonce = (musig_sign_verify_vector *)
               (*(ulong *)(auStack_940 + lVar169 + 0x10) ^ *(ulong *)(auStack_900 + lVar169 + -0x10)
               | *(ulong *)(auStack_940 + lVar169 + 8) ^ *(ulong *)(auStack_900 + lVar169 + -0x18) |
                 *(ulong *)(auStack_940 + lVar169) ^ (ulong)pmVar176);
    keyagg_cache_00 =
         (musig_sign_verify_vector *)
         (*(ulong *)(auStack_940 + lVar169 + 0x18) ^ (ulong)sha2 | (ulong)aggnonce);
    if (keyagg_cache_00 == (musig_sign_verify_vector *)0x0) goto LAB_00154bf6;
    lVar180 = lVar164;
    puVar187 = puVar166;
    if (keyagg_cache_01 < (musig_sign_verify_vector *)0x5) {
      do {
        if ((((*(ulong *)(auStack_940 + lVar169) == puVar187[-7]) &&
             (*(ulong *)(auStack_940 + lVar169 + 8) == puVar187[-6])) &&
            (*(ulong *)(auStack_940 + lVar169 + 0x10) == puVar187[-5])) &&
           (*(ulong *)(auStack_940 + lVar169 + 0x18) == puVar187[-4])) goto LAB_00153f69;
        if (((pmVar176 == (musig_sign_verify_vector *)puVar187[-3]) &&
            (*(ulong *)(auStack_900 + lVar169 + -0x18) == puVar187[-2])) &&
           ((*(ulong *)(auStack_900 + lVar169 + -0x10) == puVar187[-1] &&
            (sha2 == (musig_sign_verify_vector *)*puVar187)))) goto LAB_00153f6e;
        puVar187 = puVar187 + 8;
        lVar180 = lVar180 + -1;
      } while (lVar180 != 0);
    }
    keyagg_cache_01 =
         (musig_key_agg_vector *)
         ((long)&((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_01)->sk)
                 ->built + 1);
    lVar164 = lVar164 + -1;
    puVar166 = puVar166 + 8;
  } while ((musig_sign_verify_vector *)keyagg_cache_01 != (musig_sign_verify_vector *)0x6);
  if (0 < COUNT) {
    pmVar171 = (musig_sign_verify_vector *)0x0;
    do {
      keyagg_cache_01 = (musig_key_agg_vector *)(auStack_700 + 0x20);
      keyagg_cache = (musig_nonce_agg_vector *)auStack_700;
      sha2 = (musig_sign_verify_vector *)auStack_a20;
      cache_i = (musig_tweak_vector *)auStack_cb0;
      aggnonce = (musig_sign_verify_vector *)0x0;
      do {
        *(musig_sign_verify_vector **)(asStack_d90[0].data + (long)aggnonce * 8) = sha2;
        pmStackY_dd8 = (musig_tweak_vector *)0x153354;
        testrand256(cache_i->sk);
        pmStackY_dd8 = (musig_tweak_vector *)0x153366;
        iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keyagg_cache,cache_i->sk);
        uVar152 = uStack_6a8;
        uVar151 = uStack_6b0;
        uVar150 = uStack_6b8;
        uVar149 = uStack_6c0;
        uVar148 = uStack_6c8;
        uVar147 = uStack_6d0;
        psVar158 = psStack_6d8;
        *(uchar **)sha2->sk = puStack_6e0;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->scalar_offset).d[0] = (uint64_t)psVar158;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->scalar_offset).d[1] = uVar147;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->scalar_offset).d[2] = uVar148;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->scalar_offset).d[3] = uVar149;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->ge_offset).x.n[0] = uVar150;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->ge_offset).x.n[1] = uVar151;
        (((secp256k1_ecmult_gen_context *)sha2->sk)->ge_offset).x.n[2] = uVar152;
        keyagg_cache_00 = pmVar171;
        if (iVar153 == 0) goto LAB_00154792;
        aggnonce = (musig_sign_verify_vector *)
                   ((long)&((secp256k1_ecmult_gen_context *)aggnonce->sk)->built + 1);
        cache_i = (musig_tweak_vector *)
                  ((((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)cache_i)->sk)->
                   scalar_offset).d + 3);
        sha2 = (musig_sign_verify_vector *)
               ((((secp256k1_ecmult_gen_context *)sha2->sk)->ge_offset).x.n + 3);
      } while (aggnonce == (musig_sign_verify_vector *)0x1);
      cache_i = (musig_tweak_vector *)auStack_b60;
      pmStackY_dd8 = (musig_tweak_vector *)0x1533c6;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_pubkey_agg
                          (CTX,(secp256k1_xonly_pubkey *)keyagg_cache,
                           (secp256k1_musig_keyagg_cache *)cache_i,(secp256k1_pubkey **)asStack_d90,
                           2);
      if (iVar153 == 0) goto LAB_00154c64;
      pmStackY_dd8 = (musig_tweak_vector *)0x1533e9;
      musig_tweak_test_helper
                ((secp256k1_xonly_pubkey *)keyagg_cache,auStack_cb0,auStack_cb0 + 0x20,
                 (secp256k1_musig_keyagg_cache *)cache_i);
      pmStackY_dd8 = (musig_tweak_vector *)0x153400;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_pubkey_get
                          (CTX,(secp256k1_pubkey *)auStack_940,
                           (secp256k1_musig_keyagg_cache *)cache_i);
      if (iVar153 == 0) goto LAB_00154c69;
      keyagg_cache = (musig_nonce_agg_vector *)0x1;
      keyagg_cache_00 = (musig_sign_verify_vector *)auStack_900;
      do {
        uVar147 = secp256k1_test_state[0];
        cache_i = (musig_tweak_vector *)auStack_b60;
        uVar165 = secp256k1_test_state[3] + secp256k1_test_state[0];
        uVar175 = secp256k1_test_state[1] << 0x11;
        uVar183 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar173 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar183;
        secp256k1_test_state[0] = uVar173 ^ secp256k1_test_state[0];
        secp256k1_test_state[2] = uVar183 ^ uVar175;
        secp256k1_test_state[3] = uVar173 << 0x2d | uVar173 >> 0x13;
        pmStackY_dd8 = (musig_tweak_vector *)0x153487;
        testrand256(auStack_be0);
        keyagg_cache_01 = (musig_key_agg_vector *)((long)keyagg_cache * 0x40);
        sha2 = (musig_sign_verify_vector *)((uVar165 * 0x800000 | uVar165 >> 0x29) + uVar147);
        aggnonce = (musig_sign_verify_vector *)(auStack_940 + (long)keyagg_cache * 0x40);
        pmVar176 = (musig_sign_verify_vector *)CTX;
        if (-1 < (long)sha2) {
          pmStackY_dd8 = (musig_tweak_vector *)0x1534b3;
          iVar153 = secp256k1_musig_pubkey_tweak_add_internal
                              (CTX,(secp256k1_pubkey *)aggnonce,
                               (secp256k1_musig_keyagg_cache *)cache_i,auStack_be0,0);
          if (iVar153 != 0) goto LAB_001534cf;
          pmStackY_dd8 = (musig_tweak_vector *)0x154bd3;
          run_musig_tests_cold_90();
LAB_00154bd3:
          pmStackY_dd8 = (musig_tweak_vector *)0x154bd8;
          run_musig_tests_cold_88();
LAB_00154bd8:
          pmStackY_dd8 = (musig_tweak_vector *)0x154bdd;
          run_musig_tests_cold_11();
          goto LAB_00154bdd;
        }
        pmStackY_dd8 = (musig_tweak_vector *)0x1534c7;
        iVar153 = secp256k1_musig_pubkey_tweak_add_internal
                            (CTX,(secp256k1_pubkey *)aggnonce,
                             (secp256k1_musig_keyagg_cache *)cache_i,auStack_be0,1);
        if (iVar153 == 0) goto LAB_00154be2;
LAB_001534cf:
        cache_i = (musig_tweak_vector *)(auStack_700 + (long)keyagg_cache * 0x40);
        pmStackY_dd8 = (musig_tweak_vector *)0x1534f4;
        iVar153 = secp256k1_xonly_pubkey_from_pubkey
                            (CTX,(secp256k1_xonly_pubkey *)cache_i,(int *)auStack_c20,
                             (secp256k1_pubkey *)aggnonce);
        if (iVar153 == 0) goto LAB_00154797;
        pmVar176 = (musig_sign_verify_vector *)CTX;
        if (-1 < (long)sha2) {
          sStack_d40.data._0_8_ =
               *(undefined8 *)
                (auStack_940 +
                (long)(((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                       verify_error_case[1].key_indices + 2));
          sStack_d40.data._8_8_ =
               *(undefined8 *)
                (auStack_900 +
                (long)(((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                       verify_error_case + 1));
          sStack_d40.data._16_8_ =
               *(undefined8 *)
                (auStack_940 +
                (long)((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                      verify_error_case[1].nonce_indices);
          sStack_d40.data._24_8_ =
               *(undefined8 *)
                (((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->verify_error_case
                 [1].sig + (long)(auStack_900 + 0x10));
          sStack_d40.data._32_8_ =
               *(undefined8 *)
                (auStack_940 +
                (long)(((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                       verify_error_case[1].nonce_indices + 2));
          sStack_d40.data._40_8_ =
               *(undefined8 *)
                ((long)((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                       verify_error_case[1].key_indices + (long)(auStack_900 + -8));
          sStack_d40.data._48_8_ =
               *(undefined8 *)
                (auStack_940 +
                (long)&((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                       verify_error_case[1].signer_index);
          sStack_d40.data._56_8_ =
               *(undefined8 *)
                ((long)((musig_sign_verify_vector *)((long)keyagg_cache_01 + -0xc98))->
                       verify_error_case[1].key_indices + (long)(auStack_900 + 8));
          keyagg_cache_01 = (musig_key_agg_vector *)auStack_be0;
          pmStackY_dd8 = (musig_tweak_vector *)0x153564;
          iVar153 = secp256k1_ec_pubkey_tweak_add
                              (CTX,(secp256k1_pubkey *)&sStack_d40,(uchar *)keyagg_cache_01);
          if (iVar153 == 0) goto LAB_00154bd3;
          lVar164 = 0;
          do {
            bVar188 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->
                                      scalar_offset).d + lVar164 + -8);
            pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
            iVar153 = (uint)sStack_d40.data[lVar164] - (uint)bVar188;
            if (sStack_d40.data[lVar164] != bVar188) goto LAB_00153594;
            lVar164 = lVar164 + 1;
          } while (lVar164 != 0x40);
          iVar153 = 0;
LAB_00153594:
          if (iVar153 == 0) goto LAB_001535f8;
          goto LAB_00154bd8;
        }
        sha2 = (musig_sign_verify_vector *)&sStack_d40;
        pmStackY_dd8 = (musig_tweak_vector *)0x1535b7;
        iVar153 = secp256k1_xonly_pubkey_serialize
                            (CTX,(uchar *)sha2,(secp256k1_xonly_pubkey *)cache_i);
        if (iVar153 == 0) goto LAB_00154be7;
        keyagg_cache_01 = (musig_key_agg_vector *)auStack_be0;
        pmStackY_dd8 = (musig_tweak_vector *)0x1535f0;
        pmVar176 = (musig_sign_verify_vector *)CTX;
        iVar153 = secp256k1_xonly_pubkey_tweak_add_check
                            (CTX,(uchar *)sha2,auStack_c20._0_4_,&sStack_740 + (long)keyagg_cache,
                             (uchar *)keyagg_cache_01);
        if (iVar153 == 0) goto LAB_00154bec;
LAB_001535f8:
        pmStackY_dd8 = (musig_tweak_vector *)0x15361b;
        musig_tweak_test_helper
                  ((secp256k1_xonly_pubkey *)cache_i,auStack_cb0,auStack_cb0 + 0x20,
                   (secp256k1_musig_keyagg_cache *)auStack_b60);
        keyagg_cache = (musig_nonce_agg_vector *)
                       ((long)*(uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk + 1);
        keyagg_cache_00 =
             (musig_sign_verify_vector *)
             ((((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->ge_offset).x.n + 3);
      } while ((musig_tweak_vector *)keyagg_cache != (musig_tweak_vector *)0x9);
      uVar167 = (int)pmVar171 + 1;
      pmVar171 = (musig_sign_verify_vector *)(ulong)uVar167;
    } while ((int)uVar167 < COUNT);
  }
  sha2 = (musig_sign_verify_vector *)auStack_700;
  auStack_700 = (undefined1  [8])0xc8fff302b399d5e0;
  psStack_6f8 = (secp256k1_keypair *)0x7c5b7f16badac71;
  puStack_6f0 = (uchar *)0x2a72ecf89701e2ef;
  puStack_6e8 = (uchar *)0xab148a38201a4c7b;
  sStack_6a0 = 0x40;
  pmStackY_dd8 = (musig_tweak_vector *)0x153694;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"KeyAgg list",0xb);
  pmStackY_dd8 = (musig_tweak_vector *)0x15369f;
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0x6a480de6ef02c5a;
  psStack_6f8 = (secp256k1_keypair *)0x1d1134f21f298665;
  puStack_6f0 = (uchar *)0x52da414756a0b063;
  puStack_6e8 = (uchar *)0x4484be15f280d9d4;
  sStack_6a0 = 0x40;
  pmStackY_dd8 = (musig_tweak_vector *)0x1536d4;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)auStack_940,(uchar *)"KeyAgg coefficient",0x12);
  pmStackY_dd8 = (musig_tweak_vector *)0x1536df;
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0xf463fe7ea19e884b;
  psStack_6f8 = (secp256k1_keypair *)0xbeb0f9ff2f18f9a2;
  puStack_6f0 = (uchar *)0x6ebd26f0f37e8b0;
  puStack_6e8 = (uchar *)0x522fb150e3b243d2;
  sStack_6a0 = 0x40;
  pmStackY_dd8 = (musig_tweak_vector *)0x153714;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"MuSig/aux",9);
  pmStackY_dd8 = (musig_tweak_vector *)0x15371f;
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0x1800341407101b64;
  psStack_6f8 = (secp256k1_keypair *)0xe6258ee0391bc43;
  puStack_6f0 = (uchar *)0x8343937e29d26b72;
  puStack_6e8 = (uchar *)0xff568a30b7a0a4fb;
  sStack_6a0 = 0x40;
  pmStackY_dd8 = (musig_tweak_vector *)0x153754;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"MuSig/nonce",0xb);
  pmStackY_dd8 = (musig_tweak_vector *)0x15375f;
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)sha2);
  auStack_700 = (undefined1  [8])0x6bf7e532c7d5a45;
  psStack_6f8 = (secp256k1_keypair *)0x971254c089be68a6;
  puStack_6f0 = (uchar *)0x72846dcd60ac12d2;
  puStack_6e8 = (uchar *)0xde7a25006c81212f;
  sStack_6a0 = 0x40;
  pmStackY_dd8 = (musig_tweak_vector *)0x153794;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"MuSig/noncecoef",0xf)
  ;
  pmStackY_dd8 = (musig_tweak_vector *)0x15379f;
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)sha2);
  keyagg_cache = (musig_nonce_agg_vector *)musig_key_agg_vector.valid_case[0].expected;
  aggnonce = (musig_sign_verify_vector *)0x0;
  keyagg_cache_01 = &musig_key_agg_vector;
  pmVar171 = (musig_sign_verify_vector *)musig_key_agg_vector.tweaks;
  cache_i = (musig_tweak_vector *)auStack_b60;
  do {
    pmStackY_dd8 = (musig_tweak_vector *)0x1537ff;
    pmVar176 = (musig_sign_verify_vector *)cache_i;
    iVar153 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)cache_i,(secp256k1_musig_keyagg_cache *)auStack_940,
                         (uchar *)sha2,(uchar (*) [33])&musig_key_agg_vector,
                         musig_key_agg_vector.tweaks,
                         musig_key_agg_vector.valid_case[(long)aggnonce].key_indices_len,
                         musig_key_agg_vector.valid_case[(long)aggnonce].key_indices,0,(size_t *)0x0
                         ,(int *)0x0);
    if (iVar153 == 0) goto LAB_00154c0a;
    lVar164 = 0;
    do {
      bVar188 = *(uchar *)((long)*(uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk + lVar164
                          );
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
      iVar153 = (uint)(byte)auStack_700[lVar164] - (uint)bVar188;
      if (auStack_700[lVar164] != bVar188) goto LAB_0015382f;
      lVar164 = lVar164 + 1;
    } while (lVar164 != 0x20);
    iVar153 = 0;
LAB_0015382f:
    if (iVar153 != 0) goto LAB_00154c0f;
    aggnonce = (musig_sign_verify_vector *)
               ((long)&((secp256k1_ecmult_gen_context *)aggnonce->sk)->built + 1);
    keyagg_cache = (musig_nonce_agg_vector *)
                   (((uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk)[1] + 6);
  } while (aggnonce != (musig_sign_verify_vector *)0x4);
  aggnonce = (musig_sign_verify_vector *)0x0;
  sha2 = (musig_sign_verify_vector *)musig_key_agg_vector.tweaks;
  cache_i = (musig_tweak_vector *)auStack_700;
  pmVar171 = (musig_sign_verify_vector *)auStack_940;
  do {
    pmStackY_dd8 = (musig_tweak_vector *)0x1538aa;
    pmVar176 = (musig_sign_verify_vector *)cache_i;
    iVar153 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)cache_i,(secp256k1_musig_keyagg_cache *)pmVar171,
                         (uchar *)0x0,(uchar (*) [33])&musig_key_agg_vector,
                         musig_key_agg_vector.tweaks,
                         aggnonce[0x221].verify_error_case[0].nonce_indices_len,
                         aggnonce[0x221].verify_error_case[0].nonce_indices,
                         aggnonce[0x221].verify_error_case[0].signer_index,
                         (size_t *)&aggnonce[0x221].verify_error_case[0].error,
                         (int *)(aggnonce[0x221].verify_error_case + 1));
    if (iVar153 != 0) goto LAB_00154c1e;
    if (*(int *)(aggnonce[0x221].verify_error_case[1].sig + 4) != auStack_700._0_4_)
    goto LAB_00154c23;
    aggnonce = (musig_sign_verify_vector *)
               ((((secp256k1_ecmult_gen_context *)aggnonce->sk)->ge_offset).x.n + 3);
  } while (aggnonce != (musig_sign_verify_vector *)0x140);
  keyagg_cache_00 =
       (musig_sign_verify_vector *)musig_nonce_gen_vector.test_case[0].expected_secnonce;
  keyagg_cache_01 =
       (musig_key_agg_vector *)(musig_nonce_gen_vector.test_case[0].expected_secnonce + 0x40);
  aggnonce = (musig_sign_verify_vector *)musig_nonce_gen_vector.test_case[0].expected_pubnonce;
  keyagg_cache = (musig_nonce_agg_vector *)auStack_cb0;
  lVar164 = 0;
  do {
    cache_i = (musig_tweak_vector *)auStack_940;
    pmVar171 = (musig_sign_verify_vector *)(musig_nonce_gen_vector.test_case + lVar164);
    sStack_d40.data._0_8_ = *(undefined8 *)musig_nonce_gen_vector.test_case[lVar164].rand_;
    sStack_d40.data._8_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar164].rand_ + 8);
    sStack_d40.data._16_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar164].rand_ + 0x10)
    ;
    sStack_d40.data._24_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar164].rand_ + 0x18)
    ;
    puVar160 = musig_nonce_gen_vector.test_case[lVar164].sk;
    if (musig_nonce_gen_vector.test_case[lVar164].has_sk == 0) {
      puVar160 = (uchar *)0x0;
    }
    cache = (secp256k1_musig_keyagg_cache *)0x0;
    if (musig_nonce_gen_vector.test_case[lVar164].has_aggpk != 0) {
      pmStackY_dd8 = (musig_tweak_vector *)0x153962;
      memset(cache_i,0,0xf8);
      sha2 = (musig_sign_verify_vector *)auStack_b60;
      pmStackY_dd8 = (musig_tweak_vector *)0x15397e;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)sha2,
                           musig_nonce_gen_vector.test_case[lVar164].aggpk);
      if (iVar153 == 0) goto LAB_00154c5a;
      pmStackY_dd8 = (musig_tweak_vector *)0x153998;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_pubkey_load(CTX,(secp256k1_ge *)cache_i,(secp256k1_pubkey *)sha2);
      if (iVar153 == 0) goto LAB_00154c5f;
      cache = (secp256k1_musig_keyagg_cache *)auStack_700;
      pmStackY_dd8 = (musig_tweak_vector *)0x1539b3;
      secp256k1_keyagg_cache_save(cache,(secp256k1_keyagg_cache_internal *)cache_i);
    }
    uVar167 = musig_nonce_gen_vector.test_case[lVar164].has_msg;
    cache_i = (musig_tweak_vector *)(ulong)uVar167;
    uVar156 = musig_nonce_gen_vector.test_case[lVar164].has_extra_in;
    sha2 = (musig_sign_verify_vector *)(ulong)uVar156;
    pmStackY_dd8 = (musig_tweak_vector *)0x1539e1;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)keyagg_cache,
                         musig_nonce_gen_vector.test_case[lVar164].pk,0x21);
    if (iVar153 == 0) goto LAB_00154c28;
    puVar159 = musig_nonce_gen_vector.test_case[lVar164].extra_in;
    if (uVar156 == 0) {
      puVar159 = (uchar *)0x0;
    }
    pmVar171 = (musig_sign_verify_vector *)musig_nonce_gen_vector.test_case[lVar164].msg;
    sha2 = (musig_sign_verify_vector *)0x0;
    if (uVar167 == 0) {
      pmVar171 = (musig_sign_verify_vector *)0x0;
    }
    cache_i = (musig_tweak_vector *)auStack_940;
    pmStackY_dd8 = (musig_tweak_vector *)0x153a51;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_nonce_gen
                        (CTX,(secp256k1_musig_secnonce *)cache_i,
                         (secp256k1_musig_pubnonce *)auStack_b60,sStack_d40.data,puVar160,
                         (secp256k1_pubkey *)keyagg_cache,pmVar171->sk,cache,puVar159);
    if (iVar153 != 1) goto LAB_00154c2d;
    lVar169 = 0;
    do {
      bVar188 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->
                                scalar_offset).d + lVar169 + -8);
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
      iVar153 = (uint)(byte)auStack_940[lVar169 + 4] - (uint)bVar188;
      if (auStack_940[lVar169 + 4] != bVar188) goto LAB_00153a87;
      lVar169 = lVar169 + 1;
    } while (lVar169 != 0x40);
    iVar153 = 0;
LAB_00153a87:
    if (iVar153 != 0) goto LAB_00154c32;
    uVar165 = 0;
    do {
      bVar188 = auStack_cb0[uVar165];
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
      iVar153 = (uint)(byte)auStack_900[uVar165 + 4] - (uint)bVar188;
      if (auStack_900[uVar165 + 4] != bVar188) goto LAB_00153aba;
      uVar165 = uVar165 + 1;
    } while (uVar165 != 0x40);
    iVar153 = 0;
LAB_00153aba:
    if (iVar153 != 0) goto LAB_00154c37;
    lVar169 = -0x21;
    do {
      uVar173 = uVar165 & 0xffffffff;
      bVar188 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)
                                 ((musig_sign_verify_vector *)keyagg_cache_01)->sk)->scalar_offset).
                                d + lVar169 + 0x19);
      bVar2 = *(uchar *)((long)keyagg_cache_01 + lVar169 + -0xaf);
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar2;
      uVar165 = (ulong)((uint)bVar188 - (uint)bVar2);
      if (bVar188 == bVar2) {
        uVar165 = uVar173;
      }
      iVar153 = (int)uVar165;
      if (bVar188 != bVar2) goto LAB_00153aed;
      lVar169 = lVar169 + 1;
    } while (lVar169 != 0);
    iVar153 = 0;
LAB_00153aed:
    if (iVar153 != 0) goto LAB_00154c3c;
    pmStackY_dd8 = (musig_tweak_vector *)0x153b11;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_pubnonce_serialize
                        (CTX,auStack_a20,(secp256k1_musig_pubnonce *)auStack_b60);
    if (iVar153 == 0) goto LAB_00154c41;
    lVar169 = 0;
    do {
      bVar188 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)aggnonce->sk)->scalar_offset).d +
                         lVar169 + -8);
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
      iVar153 = (uint)(byte)auStack_a20[lVar169] - (uint)bVar188;
      if (auStack_a20[lVar169] != bVar188) goto LAB_00153b41;
      lVar169 = lVar169 + 1;
    } while (lVar169 != 0x42);
    iVar153 = 0;
LAB_00153b41:
    if (iVar153 != 0) goto LAB_00154c46;
    keyagg_cache_00 = (musig_sign_verify_vector *)(keyagg_cache_00->secnonces[1] + 0x12);
    keyagg_cache_01 =
         (musig_key_agg_vector *)
         (((musig_sign_verify_vector *)keyagg_cache_01)->secnonces[1] + 0x12);
    aggnonce = (musig_sign_verify_vector *)(aggnonce->secnonces[1] + 0x12);
    bVar189 = lVar164 == 0;
    lVar164 = lVar164 + 1;
  } while (bVar189);
  sha2 = (musig_sign_verify_vector *)musig_nonce_agg_vector.valid_case;
  keyagg_cache_01 = (musig_key_agg_vector *)musig_nonce_agg_vector.valid_case[0].expected;
  keyagg_cache = &musig_nonce_agg_vector;
  keyagg_cache_00 = (musig_sign_verify_vector *)0x0;
LAB_00153b81:
  cache_i = (musig_tweak_vector *)auStack_940;
  aggnonce = (musig_sign_verify_vector *)0x0;
LAB_00153b84:
  pmStackY_dd8 = (musig_tweak_vector *)0x153ba5;
  iVar153 = secp256k1_musig_pubnonce_parse
                      (CTX,(secp256k1_musig_pubnonce *)cache_i,
                       musig_nonce_agg_vector.pnonces
                       [(((secp256k1_ecmult_gen_context *)sha2->sk)->scalar_offset).d
                        [(long)&aggnonce[-1].verify_error_case[1].field_0x77]]);
  if (iVar153 != 0) goto code_r0x00153bad;
  pmStackY_dd8 = (musig_tweak_vector *)0x154788;
  run_musig_tests_cold_84();
LAB_00154788:
  pmStackY_dd8 = (musig_tweak_vector *)0x15478d;
  run_musig_tests_cold_2();
  goto LAB_0015478d;
LAB_00153f5f:
  pmStackY_dd8 = (musig_tweak_vector *)0x153f64;
  run_musig_tests_cold_95();
LAB_00153f64:
  pmStackY_dd8 = (musig_tweak_vector *)0x153f69;
  run_musig_tests_cold_3();
LAB_00153f69:
  pmStackY_dd8 = (musig_tweak_vector *)0x153f6e;
  run_musig_tests_cold_6();
LAB_00153f6e:
  pmStackY_dd8 = (musig_tweak_vector *)0x153f73;
  run_musig_tests_cold_7();
LAB_00153f73:
  pmStackY_dd8 = (musig_tweak_vector *)0x153f78;
  run_musig_tests_cold_1();
  goto LAB_00153f78;
code_r0x00153bad:
  *(musig_tweak_vector **)(auStack_a20 + (long)aggnonce * 8) = cache_i;
  aggnonce = (musig_sign_verify_vector *)
             ((long)&((secp256k1_ecmult_gen_context *)aggnonce->sk)->built + 1);
  cache_i = (musig_tweak_vector *)(((musig_sign_verify_vector *)cache_i)->pubkeys[3] + 1);
  if (aggnonce != (musig_sign_verify_vector *)0x1) goto code_r0x00153bc5;
  goto LAB_00153b84;
code_r0x00153bc5:
  aggnonce = (musig_sign_verify_vector *)auStack_700;
  pmStackY_dd8 = (musig_tweak_vector *)0x153be9;
  pmVar176 = (musig_sign_verify_vector *)CTX;
  iVar153 = secp256k1_musig_nonce_agg
                      (CTX,(secp256k1_musig_aggnonce *)aggnonce,
                       (secp256k1_musig_pubnonce **)auStack_a20,2);
  if (iVar153 == 0) goto LAB_00154c4b;
  pmStackY_dd8 = (musig_tweak_vector *)0x153c08;
  pmVar176 = (musig_sign_verify_vector *)CTX;
  iVar153 = secp256k1_musig_aggnonce_serialize(CTX,auStack_b60,(secp256k1_musig_aggnonce *)aggnonce)
  ;
  if (iVar153 == 0) goto LAB_00154c50;
  lVar164 = 0;
  cache_i = (musig_tweak_vector *)auStack_940;
  do {
    bVar188 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)
                               ((musig_sign_verify_vector *)keyagg_cache_01)->sk)->scalar_offset).d
                       + lVar164 + -8);
    pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
    iVar153 = (uint)(byte)auStack_b60[lVar164] - (uint)bVar188;
    if (auStack_b60[lVar164] != bVar188) goto LAB_00153c40;
    lVar164 = lVar164 + 1;
  } while (lVar164 != 0x21);
  iVar153 = 0;
LAB_00153c40:
  if (iVar153 != 0) goto LAB_00154c55;
  sha2 = (musig_sign_verify_vector *)(sha2->pubkeys[1] + 0x17);
  keyagg_cache_01 =
       (musig_key_agg_vector *)(((musig_sign_verify_vector *)keyagg_cache_01)->pubkeys[1] + 0x17);
  bVar189 = keyagg_cache_00 != (musig_sign_verify_vector *)0x0;
  keyagg_cache_00 =
       (musig_sign_verify_vector *)
       ((long)&((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->built + 1);
  if (bVar189) goto code_r0x00153c61;
  goto LAB_00153b81;
LAB_00154bdd:
  pmStackY_dd8 = (musig_tweak_vector *)0x154be2;
  run_musig_tests_cold_72();
LAB_00154be2:
  pmStackY_dd8 = (musig_tweak_vector *)0x154be7;
  run_musig_tests_cold_8();
LAB_00154be7:
  pmStackY_dd8 = (musig_tweak_vector *)0x154bec;
  run_musig_tests_cold_10();
LAB_00154bec:
  pmStackY_dd8 = (musig_tweak_vector *)0x154bf1;
  run_musig_tests_cold_9();
  pmVar172 = (musig_sig_agg_vector *)sha2;
  pmVar171 = (musig_sign_verify_vector *)keyagg_cache_01;
LAB_00154bf1:
  pmStackY_dd8 = (musig_tweak_vector *)0x154bf6;
  run_musig_tests_cold_45();
  sha2 = (musig_sign_verify_vector *)pmVar172;
  pmVar184 = (musig_sign_verify_vector *)cache_i;
  keyagg_cache_01 = (musig_key_agg_vector *)pmVar171;
LAB_00154bf6:
  pmStackY_dd8 = (musig_tweak_vector *)0x154bfb;
  run_musig_tests_cold_5();
LAB_00154bfb:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c00;
  run_musig_tests_cold_98();
LAB_00154c00:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c05;
  run_musig_tests_cold_97();
  pmVar171 = keyagg_cache_00;
  cache_i = (musig_tweak_vector *)pmVar184;
LAB_00154c05:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c0a;
  run_musig_tests_cold_96();
LAB_00154c0a:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c0f;
  run_musig_tests_cold_87();
LAB_00154c0f:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c14;
  run_musig_tests_cold_12();
LAB_00154c14:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c19;
  run_musig_tests_cold_4();
LAB_00154c19:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c1e;
  run_musig_tests_cold_94();
LAB_00154c1e:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c23;
  run_musig_tests_cold_13();
LAB_00154c23:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c28;
  run_musig_tests_cold_14();
LAB_00154c28:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c2d;
  run_musig_tests_cold_86();
LAB_00154c2d:
  keyagg_cache_00 = pmVar171;
  pmStackY_dd8 = (musig_tweak_vector *)0x154c32;
  run_musig_tests_cold_17();
LAB_00154c32:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c37;
  run_musig_tests_cold_18();
LAB_00154c37:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c3c;
  run_musig_tests_cold_19();
LAB_00154c3c:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c41;
  run_musig_tests_cold_20();
LAB_00154c41:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c46;
  run_musig_tests_cold_85();
LAB_00154c46:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c4b;
  run_musig_tests_cold_21();
LAB_00154c4b:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c50;
  run_musig_tests_cold_83();
LAB_00154c50:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c55;
  run_musig_tests_cold_82();
LAB_00154c55:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c5a;
  run_musig_tests_cold_22();
  pmVar171 = keyagg_cache_00;
LAB_00154c5a:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c5f;
  run_musig_tests_cold_16();
LAB_00154c5f:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c64;
  run_musig_tests_cold_15();
LAB_00154c64:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c69;
  run_musig_tests_cold_92();
LAB_00154c69:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c6e;
  run_musig_tests_cold_91();
LAB_00154c6e:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c73;
  run_musig_tests_cold_81();
  pmVar184 = (musig_sign_verify_vector *)keyagg_cache_01;
LAB_00154c73:
  keyagg_cache_01 = (musig_key_agg_vector *)aggnonce;
  pmStackY_dd8 = (musig_tweak_vector *)0x154c78;
  run_musig_tests_cold_80();
LAB_00154c78:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c7d;
  run_musig_tests_cold_79();
  aggnonce = (musig_sign_verify_vector *)keyagg_cache_01;
  keyagg_cache_01 = (musig_key_agg_vector *)pmVar184;
LAB_00154c7d:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c82;
  run_musig_tests_cold_78();
  pmVar184 = (musig_sign_verify_vector *)cache_i;
LAB_00154c82:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c87;
  run_musig_tests_cold_77();
LAB_00154c87:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c8c;
  run_musig_tests_cold_76();
LAB_00154c8c:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c91;
  run_musig_tests_cold_25();
LAB_00154c91:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c96;
  run_musig_tests_cold_26();
LAB_00154c96:
  pmStackY_dd8 = (musig_tweak_vector *)0x154c9b;
  run_musig_tests_cold_75();
LAB_00154c9b:
  pmStackY_dd8 = (musig_tweak_vector *)0x154ca0;
  run_musig_tests_cold_74();
LAB_00154ca0:
  pmStackY_dd8 = (musig_tweak_vector *)0x154ca5;
  run_musig_tests_cold_73();
  keyagg_cache_00 = pmVar171;
  cache_i = (musig_tweak_vector *)pmVar184;
LAB_00154ca5:
  pmStackY_dd8 = (musig_tweak_vector *)0x154caa;
  run_musig_tests_cold_27();
LAB_00154caa:
  pmStackY_dd8 = (musig_tweak_vector *)0x154caf;
  run_musig_tests_cold_71();
LAB_00154caf:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cb4;
  run_musig_tests_cold_70();
LAB_00154cb4:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cb9;
  run_musig_tests_cold_69();
LAB_00154cb9:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cbe;
  run_musig_tests_cold_68();
  pmVar184 = (musig_sign_verify_vector *)cache_i;
LAB_00154cbe:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cc3;
  run_musig_tests_cold_35();
LAB_00154cc3:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cc8;
  run_musig_tests_cold_37();
LAB_00154cc8:
  cache_i = (musig_tweak_vector *)aggnonce;
  pmStackY_dd8 = (musig_tweak_vector *)0x154ccd;
  run_musig_tests_cold_65();
  pmVar171 = sha2;
LAB_00154ccd:
  sha2 = keyagg_cache_00;
  pmStackY_dd8 = (musig_tweak_vector *)0x154cd2;
  run_musig_tests_cold_64();
LAB_00154cd2:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cd7;
  run_musig_tests_cold_63();
LAB_00154cd7:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cdc;
  run_musig_tests_cold_62();
  pmVar170 = sha2;
  aggnonce = (musig_sign_verify_vector *)cache_i;
LAB_00154cdc:
  cache_i = (musig_tweak_vector *)keyagg_cache;
  sha2 = pmVar171;
  pmStackY_dd8 = (musig_tweak_vector *)0x154ce1;
  run_musig_tests_cold_41();
LAB_00154ce1:
  pmStackY_dd8 = (musig_tweak_vector *)0x154ce6;
  run_musig_tests_cold_42();
  keyagg_cache = (musig_nonce_agg_vector *)cache_i;
LAB_00154ce6:
  pmStackY_dd8 = (musig_tweak_vector *)0x154ceb;
  run_musig_tests_cold_61();
LAB_00154ceb:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cf0;
  run_musig_tests_cold_60();
  keyagg_cache_00 = pmVar170;
  cache_i = (musig_tweak_vector *)pmVar184;
LAB_00154cf0:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cf5;
  run_musig_tests_cold_29();
  pmVar172 = (musig_sig_agg_vector *)sha2;
LAB_00154cf5:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cfa;
  run_musig_tests_cold_59();
LAB_00154cfa:
  pmStackY_dd8 = (musig_tweak_vector *)0x154cff;
  run_musig_tests_cold_58();
  sha2 = (musig_sign_verify_vector *)pmVar172;
  pmVar184 = (musig_sign_verify_vector *)cache_i;
LAB_00154cff:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d04;
  run_musig_tests_cold_57();
LAB_00154d04:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d09;
  run_musig_tests_cold_39();
  cache_i = (musig_tweak_vector *)pmVar184;
  pmVar171 = (musig_sign_verify_vector *)keyagg_cache_01;
LAB_00154d09:
  keyagg_cache_01 = (musig_key_agg_vector *)pmVar171;
  pmStackY_dd8 = (musig_tweak_vector *)0x154d0e;
  run_musig_tests_cold_46();
LAB_00154d0e:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d13;
  run_musig_tests_cold_47();
LAB_00154d13:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d18;
  run_musig_tests_cold_56();
LAB_00154d18:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d1d;
  run_musig_tests_cold_55();
LAB_00154d1d:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d22;
  run_musig_tests_cold_54();
LAB_00154d22:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d27;
  run_musig_tests_cold_36();
  pmVar184 = (musig_sign_verify_vector *)cache_i;
LAB_00154d27:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d2c;
  run_musig_tests_cold_28();
LAB_00154d2c:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d31;
  run_musig_tests_cold_38();
LAB_00154d31:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d36;
  run_musig_tests_cold_34();
  pmVar171 = pmVar184;
LAB_00154d36:
  pmVar184 = pmVar171;
  pmStackY_dd8 = (musig_tweak_vector *)0x154d3b;
  run_musig_tests_cold_33();
  pmVar170 = sha2;
LAB_00154d3b:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d40;
  run_musig_tests_cold_30();
LAB_00154d40:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d45;
  run_musig_tests_cold_31();
  sha2 = pmVar170;
LAB_00154d45:
  pmStackY_dd8 = (musig_tweak_vector *)0x154d4a;
  run_musig_tests_cold_32();
  goto LAB_00154d4a;
LAB_0015478d:
  pmStackY_dd8 = (musig_tweak_vector *)0x154792;
  run_musig_tests_cold_23();
LAB_00154792:
  pmStackY_dd8 = (musig_tweak_vector *)0x154797;
  run_musig_tests_cold_93();
LAB_00154797:
  pmStackY_dd8 = (musig_tweak_vector *)0x15479c;
  run_musig_tests_cold_89();
  goto LAB_0015479c;
code_r0x00153c61:
  aggnonce = (musig_sign_verify_vector *)musig_nonce_agg_vector.error_case;
  lVar164 = 0;
  do {
    cache_i = (musig_tweak_vector *)
              (ulong)(uint)musig_nonce_agg_vector.error_case[lVar164].invalid_nonce_idx;
    sha2 = (musig_sign_verify_vector *)auStack_940;
    keyagg_cache_00 = (musig_sign_verify_vector *)0x0;
    do {
      keyagg_cache_01 =
           (musig_key_agg_vector *)(ulong)((musig_sign_verify_vector *)cache_i != keyagg_cache_00);
      pmStackY_dd8 = (musig_tweak_vector *)0x153cb1;
      uVar167 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)sha2,
                           musig_nonce_agg_vector.pnonces
                           [(((secp256k1_ecmult_gen_context *)aggnonce->sk)->scalar_offset).d
                            [(long)&keyagg_cache_00[-1].verify_error_case[1].field_0x77]]);
      if (uVar167 != ((musig_sign_verify_vector *)cache_i != keyagg_cache_00)) goto LAB_0015478d;
      keyagg_cache_00 =
           (musig_sign_verify_vector *)
           ((long)&((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->built + 1);
      sha2 = (musig_sign_verify_vector *)(sha2->pubkeys[3] + 1);
    } while (keyagg_cache_00 == (musig_sign_verify_vector *)0x1);
    lVar164 = lVar164 + 1;
    aggnonce = (musig_sign_verify_vector *)(aggnonce->pubkeys[1] + 0x17);
  } while (lVar164 != 3);
  pmVar171 = (musig_sign_verify_vector *)musig_sign_verify_vector.valid_case[0].expected;
  cache_i = (musig_tweak_vector *)0x0;
  keyagg_cache_01 = (musig_key_agg_vector *)auStack_940;
  do {
    sha2 = &musig_sign_verify_vector;
    pmStackY_dd8 = (musig_tweak_vector *)0x153d0c;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_keypair_create(CTX,&sStack_d40,musig_sign_verify_vector.sk);
    if (iVar153 == 0) goto LAB_00154c6e;
    keyagg_cache = (musig_nonce_agg_vector *)(musig_sign_verify_vector.valid_case + (long)cache_i);
    pmVar176 = (musig_sign_verify_vector *)auStack_a60;
    pmStackY_dd8 = (musig_tweak_vector *)0x153d5c;
    iVar153 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar176,(secp256k1_musig_keyagg_cache *)keyagg_cache_01,
                         (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                         *(size_t *)*(uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk,
                         musig_sign_verify_vector.valid_case[(long)cache_i].key_indices,0,
                         (size_t *)0x0,(int *)0x0);
    pmVar184 = (musig_sign_verify_vector *)keyagg_cache_01;
    if (iVar153 == 0) goto LAB_00154c73;
    pmVar184 = (musig_sign_verify_vector *)auStack_a20;
    pmStackY_dd8 = (musig_tweak_vector *)0x153d98;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_aggnonce_parse
                        (CTX,(secp256k1_musig_aggnonce *)pmVar184,
                         musig_sign_verify_vector.aggnonces
                         [musig_sign_verify_vector.valid_case[(long)cache_i].aggnonce_index]);
    if (iVar153 == 0) goto LAB_00154c78;
    pmStackY_dd8 = (musig_tweak_vector *)0x153dd5;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_nonce_process
                        (CTX,(secp256k1_musig_session *)auStack_700,
                         (secp256k1_musig_aggnonce *)pmVar184,
                         musig_sign_verify_vector.msgs
                         [musig_sign_verify_vector.valid_case[(long)cache_i].msg_index],
                         (secp256k1_musig_keyagg_cache *)keyagg_cache_01);
    aggnonce = (musig_sign_verify_vector *)keyagg_cache_01;
    if (iVar153 == 0) goto LAB_00154c7d;
    aggnonce = (musig_sign_verify_vector *)auStack_be0;
    pmStackY_dd8 = (musig_tweak_vector *)0x153e00;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)aggnonce,musig_sign_verify_vector.pubkeys[0],0x21);
    pmVar184 = (musig_sign_verify_vector *)cache_i;
    if (iVar153 == 0) goto LAB_00154c82;
    sha2 = (musig_sign_verify_vector *)auStack_cb0;
    pmStackY_dd8 = (musig_tweak_vector *)0x153e22;
    musig_test_set_secnonce
              ((secp256k1_musig_secnonce *)sha2,musig_sign_verify_vector.secnonces[0],
               (secp256k1_pubkey *)aggnonce);
    pmVar184 = (musig_sign_verify_vector *)asStack_d90;
    pmStackY_dd8 = (musig_tweak_vector *)0x153e4c;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_partial_sign
                        (CTX,(secp256k1_musig_partial_sig *)pmVar184,
                         (secp256k1_musig_secnonce *)sha2,&sStack_d40,
                         (secp256k1_musig_keyagg_cache *)keyagg_cache_01,
                         (secp256k1_musig_session *)auStack_700);
    if (iVar153 == 0) goto LAB_00154c87;
    lVar164 = 0;
    sha2 = &musig_sign_verify_vector;
    do {
      keyagg_cache = (musig_nonce_agg_vector *)
                     (ulong)((uint)asStack_d90[0].data[lVar164] -
                            (uint)secp256k1_musig_partial_sig_magic[lVar164]);
      if (asStack_d90[0].data[lVar164] != secp256k1_musig_partial_sig_magic[lVar164])
      goto LAB_00153e8e;
      lVar164 = lVar164 + 1;
    } while (lVar164 != 4);
    keyagg_cache = (musig_nonce_agg_vector *)0x0;
LAB_00153e8e:
    if ((int)keyagg_cache != 0) {
      pmStackY_dd8 = (musig_tweak_vector *)0x153f55;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      run_musig_tests_cold_24();
      goto LAB_00154c8c;
    }
    puVar160 = asStack_d90[0].data + 4;
    auStack_c20[0x10] = asStack_d90[0].data[0x14];
    auStack_c20[0x11] = asStack_d90[0].data[0x15];
    auStack_c20[0x12] = asStack_d90[0].data[0x16];
    auStack_c20[0x13] = asStack_d90[0].data[0x17];
    auStack_c20[0x14] = asStack_d90[0].data[0x18];
    auStack_c20[0x15] = asStack_d90[0].data[0x19];
    auStack_c20[0x16] = asStack_d90[0].data[0x1a];
    auStack_c20[0x17] = asStack_d90[0].data[0x1b];
    auStack_c20[0x18] = asStack_d90[0].data[0x1c];
    auStack_c20[0x19] = asStack_d90[0].data[0x1d];
    auStack_c20[0x1a] = asStack_d90[0].data[0x1e];
    auStack_c20[0x1b] = asStack_d90[0].data[0x1f];
    auStack_c20[0x1c] = asStack_d90[0].data[0x20];
    auStack_c20[0x1d] = asStack_d90[0].data[0x21];
    auStack_c20[0x1e] = asStack_d90[0].data[0x22];
    auStack_c20[0x1f] = asStack_d90[0].data[0x23];
    auStack_c20[0] = asStack_d90[0].data[4];
    auStack_c20[1] = asStack_d90[0].data[5];
    auStack_c20[2] = asStack_d90[0].data[6];
    auStack_c20[3] = asStack_d90[0].data[7];
    auStack_c20[4] = asStack_d90[0].data[8];
    auStack_c20[5] = asStack_d90[0].data[9];
    auStack_c20[6] = asStack_d90[0].data[10];
    auStack_c20[7] = asStack_d90[0].data[0xb];
    auStack_c20[8] = asStack_d90[0].data[0xc];
    auStack_c20[9] = asStack_d90[0].data[0xd];
    auStack_c20[10] = asStack_d90[0].data[0xe];
    auStack_c20[0xb] = asStack_d90[0].data[0xf];
    auStack_c20[0xc] = asStack_d90[0].data[0x10];
    auStack_c20[0xd] = asStack_d90[0].data[0x11];
    auStack_c20[0xe] = asStack_d90[0].data[0x12];
    auStack_c20[0xf] = asStack_d90[0].data[0x13];
    lVar164 = 0;
    keyagg_cache = (musig_nonce_agg_vector *)auStack_b60;
    do {
      puVar159 = (uchar *)((ulong)puVar160 & 0xffffffff);
      bVar188 = auStack_c20[lVar164];
      bVar2 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)pmVar171->sk)->scalar_offset).d +
                       lVar164 + -8);
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar2;
      puVar160 = (uchar *)(ulong)((uint)bVar188 - (uint)bVar2);
      if (bVar188 == bVar2) {
        puVar160 = puVar159;
      }
      iVar153 = (int)puVar160;
      if (bVar188 != bVar2) goto LAB_00153eea;
      lVar164 = lVar164 + 1;
    } while (lVar164 != 0x20);
    iVar153 = 0;
LAB_00153eea:
    if (iVar153 != 0) goto LAB_00154c91;
    pmStackY_dd8 = (musig_tweak_vector *)0x153f08;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_pubnonce_parse
                        (CTX,(secp256k1_musig_pubnonce *)keyagg_cache,
                         musig_sign_verify_vector.pubnonces[0]);
    if (iVar153 == 0) goto LAB_00154c96;
    pmStackY_dd8 = (musig_tweak_vector *)0x153f30;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_partial_sig_verify
                        (CTX,(secp256k1_musig_partial_sig *)pmVar184,
                         (secp256k1_musig_pubnonce *)keyagg_cache,(secp256k1_pubkey *)aggnonce,
                         (secp256k1_musig_keyagg_cache *)keyagg_cache_01,
                         (secp256k1_musig_session *)auStack_700);
    if (iVar153 == 0) goto LAB_00154c9b;
    cache_i = (musig_tweak_vector *)
              ((long)&((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)cache_i)->sk)->
                      built + 1);
    pmVar171 = (musig_sign_verify_vector *)(pmVar171->pubkeys[1] + 0x17);
  } while ((musig_sign_verify_vector *)cache_i != (musig_sign_verify_vector *)0x4);
LAB_00153f78:
  keyagg_cache_01 = (musig_key_agg_vector *)0x0;
  pmVar184 = (musig_sign_verify_vector *)auStack_c20;
  keyagg_cache_00 = (musig_sign_verify_vector *)&sStack_d40;
  pmVar170 = sha2;
  do {
    aggnonce = (musig_sign_verify_vector *)musig_sign_verify_vector.pubkeys;
    if ((musig_sign_verify_vector *)keyagg_cache_01 != (musig_sign_verify_vector *)0x0) {
      psVar146 = (secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_01)->sk;
      uVar167 = *(uint *)((long)&pmVar170->sign_error_case[0].error + (long)psVar146);
      keyagg_cache = (musig_nonce_agg_vector *)(ulong)uVar167;
      sha2 = (musig_sign_verify_vector *)(ulong)(uVar167 != 0);
      pmStackY_dd8 = (musig_tweak_vector *)0x153fe3;
      pmVar176 = pmVar184;
      uVar156 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)pmVar184,(secp256k1_musig_keyagg_cache *)auStack_940,
                           (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                           *(size_t *)
                            ((long)(psVar146->scalar_offset).d +
                            (long)(pmVar170->sign_error_case[0].key_indices + -2)),
                           (size_t *)
                           ((long)pmVar170->sign_error_case[0].key_indices + (long)psVar146),0,
                           (size_t *)0x0,(int *)0x0);
      cache_i = (musig_tweak_vector *)pmVar184;
      if (uVar156 != (uVar167 != 0)) goto LAB_00154ca5;
      if (uVar167 == 0) {
        pmVar170 = &musig_sign_verify_vector;
        sha2 = pmVar170;
        if (auStack_c20._0_4_ != 0) goto LAB_00154d27;
      }
      else {
        sha2 = (musig_sign_verify_vector *)(ulong)(uVar167 != 3);
        pmStackY_dd8 = (musig_tweak_vector *)0x154033;
        pmVar176 = (musig_sign_verify_vector *)CTX;
        uVar156 = secp256k1_musig_aggnonce_parse
                            (CTX,(secp256k1_musig_aggnonce *)auStack_b60,
                             musig_sign_verify_vector.aggnonces
                             [*(long *)(((musig_sign_verify_vector *)
                                        ((long)keyagg_cache_01 + 0x1ae8c8))->pubnonces[1] + 0x66)]);
        if (uVar156 != (uVar167 != 3)) goto LAB_00154cf0;
        pmVar170 = &musig_sign_verify_vector;
        if (uVar167 != 3) {
          pmStackY_dd8 = (musig_tweak_vector *)0x154089;
          pmVar176 = (musig_sign_verify_vector *)CTX;
          iVar153 = secp256k1_musig_nonce_process
                              (CTX,(secp256k1_musig_session *)auStack_700,
                               (secp256k1_musig_aggnonce *)auStack_b60,
                               musig_sign_verify_vector.msgs
                               [*(long *)(((musig_sign_verify_vector *)
                                          ((long)keyagg_cache_01 + 0x1ae8c8))->pubnonces[1] + 0x6e)]
                               ,(secp256k1_musig_keyagg_cache *)auStack_940);
          sha2 = pmVar170;
          if (iVar153 == 0) goto LAB_00154d31;
          pmStackY_dd8 = (musig_tweak_vector *)0x1540ae;
          pmVar176 = (musig_sign_verify_vector *)CTX;
          iVar153 = secp256k1_ec_pubkey_parse
                              (CTX,(secp256k1_pubkey *)keyagg_cache_00,
                               musig_sign_verify_vector.pubkeys[0],0x21);
          pmVar171 = keyagg_cache_00;
          aggnonce = pmVar184;
          if (iVar153 == 0) goto LAB_00154d36;
          pmStackY_dd8 = (musig_tweak_vector *)0x1540dd;
          musig_test_set_secnonce
                    ((secp256k1_musig_secnonce *)auStack_a20,
                     musig_sign_verify_vector.secnonces
                     [*(long *)(((musig_sign_verify_vector *)((long)keyagg_cache_01 + 0x1ae8c8))->
                                pubnonces[1] + 0x76)],(secp256k1_pubkey *)keyagg_cache_00);
          psVar168 = CTX;
          if (uVar167 == 4) {
            auStack_a60._0_4_ = 0;
            p_Var143 = (CTX->illegal_callback).fn;
            pvVar144 = (CTX->illegal_callback).data;
            asStack_d90[0].data._0_4_ = SUB84(p_Var143,0);
            asStack_d90[0].data._4_4_ = (undefined4)((ulong)p_Var143 >> 0x20);
            asStack_d90[0].data._8_4_ = SUB84(pvVar144,0);
            asStack_d90[0].data._12_4_ = (undefined4)((ulong)pvVar144 >> 0x20);
            if (CTX == &secp256k1_context_static_) {
              pmStackY_dd8 = (musig_tweak_vector *)0x154225;
              secp256k1_default_illegal_callback_fn("ctx != secp256k1_context_static",(void *)0x0);
            }
            else {
              (CTX->illegal_callback).fn = counting_callback_fn;
              (psVar168->illegal_callback).data = auStack_a60;
            }
            aggnonce = (musig_sign_verify_vector *)musig_sign_verify_vector.pubkeys;
            pmStackY_dd8 = (musig_tweak_vector *)0x15416f;
            pmVar176 = (musig_sign_verify_vector *)CTX;
            iVar153 = secp256k1_musig_partial_sign
                                (CTX,(secp256k1_musig_partial_sig *)auStack_be0,
                                 (secp256k1_musig_secnonce *)auStack_a20,
                                 (secp256k1_keypair *)auStack_cb0,
                                 (secp256k1_musig_keyagg_cache *)auStack_940,
                                 (secp256k1_musig_session *)auStack_700);
            psVar168 = CTX;
            if (iVar153 != 0) goto LAB_00154d40;
            (CTX->illegal_callback).fn =
                 (_func_void_char_ptr_void_ptr *)
                 CONCAT44(asStack_d90[0].data._4_4_,asStack_d90[0].data._0_4_);
            (psVar168->illegal_callback).data =
                 (void *)CONCAT44(asStack_d90[0].data._12_4_,asStack_d90[0].data._8_4_);
            if (auStack_a60._0_4_ != 1) goto LAB_00154d45;
          }
          else {
            pmStackY_dd8 = (musig_tweak_vector *)0x1541e9;
            pmVar176 = (musig_sign_verify_vector *)CTX;
            iVar153 = secp256k1_musig_partial_sign
                                (CTX,(secp256k1_musig_partial_sig *)auStack_be0,
                                 (secp256k1_musig_secnonce *)auStack_a20,
                                 (secp256k1_keypair *)auStack_cb0,
                                 (secp256k1_musig_keyagg_cache *)auStack_940,
                                 (secp256k1_musig_session *)auStack_700);
            aggnonce = (musig_sign_verify_vector *)musig_sign_verify_vector.pubkeys;
            if (iVar153 == 0) goto LAB_00154d3b;
          }
        }
      }
    }
    aggnonce = (musig_sign_verify_vector *)musig_sign_verify_vector.pubkeys;
    keyagg_cache_01 =
         (musig_key_agg_vector *)
         ((((secp256k1_ecmult_gen_context *)((musig_sign_verify_vector *)keyagg_cache_01)->sk)->
          ge_offset).x.n + 3);
  } while ((musig_sign_verify_vector *)keyagg_cache_01 != (musig_sign_verify_vector *)0x180);
  cache_i = (musig_tweak_vector *)musig_sign_verify_vector.verify_fail_case[0].nonce_indices;
  keyagg_cache = (musig_nonce_agg_vector *)0x0;
  do {
    keyagg_cache_00 =
         (musig_sign_verify_vector *)
         pmVar170->verify_fail_case[(long)keyagg_cache].nonce_indices_len;
    sha2 = pmVar170;
    pmVar171 = keyagg_cache_00;
    pmVar184 = (musig_sign_verify_vector *)cache_i;
    if (keyagg_cache_00 < (musig_sign_verify_vector *)0x3) goto LAB_00154ca0;
    aggnonce = (musig_sign_verify_vector *)(pmVar170->verify_fail_case + (long)keyagg_cache);
    keyagg_cache_01 = (musig_key_agg_vector *)auStack_940;
    sha2 = (musig_sign_verify_vector *)0x0;
    do {
      pmStackY_dd8 = (musig_tweak_vector *)0x154288;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)keyagg_cache_01,
                           musig_sign_verify_vector.pubnonces
                           [(((secp256k1_ecmult_gen_context *)
                             ((musig_sign_verify_vector *)cache_i)->sk)->scalar_offset).d
                            [(long)&sha2[-1].verify_error_case[1].field_0x77]]);
      if (iVar153 == 0) goto LAB_00154bdd;
      *(musig_key_agg_vector **)(auStack_be0 + (long)sha2 * 8) = keyagg_cache_01;
      sha2 = (musig_sign_verify_vector *)
             ((long)&((secp256k1_ecmult_gen_context *)sha2->sk)->built + 1);
      keyagg_cache_01 =
           (musig_key_agg_vector *)(((musig_sign_verify_vector *)keyagg_cache_01)->pubkeys[3] + 1);
    } while (keyagg_cache_00 != sha2);
    pmVar176 = (musig_sign_verify_vector *)asStack_d90;
    pmStackY_dd8 = (musig_tweak_vector *)0x1542e2;
    iVar153 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar176,(secp256k1_musig_keyagg_cache *)auStack_700,
                         (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                         pmVar170->verify_fail_case[(long)keyagg_cache].key_indices_len,
                         pmVar170->verify_fail_case[(long)keyagg_cache].key_indices,0,(size_t *)0x0,
                         (int *)0x0);
    if (iVar153 == 0) goto LAB_00154caa;
    keyagg_cache_01 = (musig_key_agg_vector *)auStack_a20;
    pmStackY_dd8 = (musig_tweak_vector *)0x15430c;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_nonce_agg
                        (CTX,(secp256k1_musig_aggnonce *)keyagg_cache_01,
                         (secp256k1_musig_pubnonce **)auStack_be0,(size_t)keyagg_cache_00);
    if (iVar153 == 0) goto LAB_00154caf;
    sha2 = &musig_sign_verify_vector;
    pmStackY_dd8 = (musig_tweak_vector *)0x15434d;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_nonce_process
                        (CTX,(secp256k1_musig_session *)auStack_b60,
                         (secp256k1_musig_aggnonce *)keyagg_cache_01,
                         musig_sign_verify_vector.msgs
                         [pmVar170->verify_fail_case[(long)keyagg_cache].msg_index],
                         (secp256k1_musig_keyagg_cache *)auStack_700);
    if (iVar153 == 0) goto LAB_00154cb4;
    pmStackY_dd8 = (musig_tweak_vector *)0x154384;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)auStack_cb0,
                         musig_sign_verify_vector.pubkeys
                         [pmVar170->verify_fail_case[(long)keyagg_cache].signer_index],0x21);
    if (iVar153 == 0) goto LAB_00154cb9;
    MVar3 = pmVar170->verify_fail_case[(long)keyagg_cache].error;
    sha2 = (musig_sign_verify_vector *)(ulong)MVar3;
    keyagg_cache_01 = (musig_key_agg_vector *)(ulong)(MVar3 != MUSIG_SIG);
    pmStackY_dd8 = (musig_tweak_vector *)0x1543b1;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    uVar167 = secp256k1_musig_partial_sig_parse
                        (CTX,(secp256k1_musig_partial_sig *)&sStack_d40,(uchar *)aggnonce);
    if (uVar167 != (MVar3 != MUSIG_SIG)) goto LAB_00154cbe;
    if (MVar3 != MUSIG_SIG) {
      aggnonce = (musig_sign_verify_vector *)(ulong)(MVar3 != MUSIG_SIG_VERIFY);
      pmStackY_dd8 = (musig_tweak_vector *)0x1543fd;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      uVar167 = secp256k1_musig_partial_sig_verify
                          (CTX,(secp256k1_musig_partial_sig *)&sStack_d40,
                           (secp256k1_musig_pubnonce *)auStack_940,(secp256k1_pubkey *)auStack_cb0,
                           (secp256k1_musig_keyagg_cache *)auStack_700,
                           (secp256k1_musig_session *)auStack_b60);
      if (uVar167 != (MVar3 != MUSIG_SIG_VERIFY)) goto LAB_00154d22;
    }
    keyagg_cache = (musig_nonce_agg_vector *)
                   ((long)*(uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk + 1);
    cache_i = (musig_tweak_vector *)(((musig_sign_verify_vector *)cache_i)->pubkeys[2] + 0x16);
    pmVar170 = &musig_sign_verify_vector;
  } while ((musig_tweak_vector *)keyagg_cache != (musig_tweak_vector *)0x3);
  keyagg_cache = (musig_nonce_agg_vector *)0x1;
  pmVar184 = (musig_sign_verify_vector *)&musig_sign_verify_vector.verify_error_case[0].error;
  keyagg_cache_01 = (musig_key_agg_vector *)auStack_b60;
  keyagg_cache_00 = (musig_sign_verify_vector *)auStack_940;
  do {
    uVar167 = ((secp256k1_ecmult_gen_context *)pmVar184->sk)->built;
    aggnonce = (musig_sign_verify_vector *)(ulong)uVar167;
    sha2 = (musig_sign_verify_vector *)(ulong)(uVar167 != 0);
    pmStackY_dd8 = (musig_tweak_vector *)0x15447a;
    pmVar176 = (musig_sign_verify_vector *)keyagg_cache_01;
    uVar156 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)keyagg_cache_01,
                         (secp256k1_musig_keyagg_cache *)keyagg_cache_00,(uchar *)0x0,
                         musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                         pmVar184[-1].verify_error_case[1].key_indices[0],
                         pmVar184[-1].verify_error_case[1].key_indices + 1,0,(size_t *)0x0,
                         (int *)0x0);
    if (uVar156 != (uVar167 != 0)) goto LAB_00154cc3;
    if (uVar167 == 0) {
      if (auStack_b60._0_4_ != 0) goto LAB_00154d2c;
    }
    else {
      sha2 = (musig_sign_verify_vector *)(ulong)(uVar167 != 2);
      pmStackY_dd8 = (musig_tweak_vector *)0x1544c3;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      uVar156 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)auStack_700,
                           musig_sign_verify_vector.pubnonces
                           [(((secp256k1_ecmult_gen_context *)pmVar184->sk)->scalar_offset).d
                            [*(long *)&pmVar184[-1].verify_error_case[1].error + -6]]);
      if (uVar156 != (uVar167 != 2)) goto LAB_00154d04;
    }
    pmVar184 = (musig_sign_verify_vector *)(pmVar184->pubkeys[2] + 0x16);
    keyagg_cache = (musig_nonce_agg_vector *)
                   (((musig_tweak_vector *)((long)keyagg_cache + -0x7f0))->error_case[0].expected +
                   0x1f);
  } while (keyagg_cache == (musig_nonce_agg_vector *)0x0);
  pmStackY_dd8 = (musig_tweak_vector *)0x154502;
  pmVar176 = (musig_sign_verify_vector *)CTX;
  iVar153 = secp256k1_musig_aggnonce_parse
                      (CTX,(secp256k1_musig_aggnonce *)auStack_b60,musig_tweak_vector.aggnonce);
  if (iVar153 == 0) {
LAB_00154d4a:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d4f;
    run_musig_tests_cold_67();
LAB_00154d4f:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d54;
    run_musig_tests_cold_66();
    cache_i = (musig_tweak_vector *)pmVar184;
LAB_00154d54:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d59;
    run_musig_tests_cold_43();
    pmVar172 = (musig_sig_agg_vector *)sha2;
LAB_00154d59:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d5e;
    run_musig_tests_cold_44();
LAB_00154d5e:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d63;
    run_musig_tests_cold_53();
LAB_00154d63:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d68;
    run_musig_tests_cold_52();
LAB_00154d68:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d6d;
    run_musig_tests_cold_48();
LAB_00154d6d:
    pmStackY_dd8 = (musig_tweak_vector *)0x154d72;
    run_musig_tests_cold_49();
  }
  else {
    pmStackY_dd8 = (musig_tweak_vector *)0x15452a;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_ec_pubkey_parse
                        (CTX,(secp256k1_pubkey *)auStack_be0,musig_tweak_vector.pubkeys[0],0x21);
    if (iVar153 == 0) goto LAB_00154d4f;
    keyagg_cache_01 = (musig_key_agg_vector *)musig_tweak_vector.valid_case[0].expected;
    keyagg_cache_00 = (musig_sign_verify_vector *)0x0;
    cache_i = &musig_tweak_vector;
    sha2 = (musig_sign_verify_vector *)auStack_cb0;
    do {
      keyagg_cache = (musig_nonce_agg_vector *)auStack_940;
      pmStackY_dd8 = (musig_tweak_vector *)0x154572;
      musig_test_set_secnonce
                ((secp256k1_musig_secnonce *)auStack_a20,musig_tweak_vector.secnonce,
                 (secp256k1_pubkey *)auStack_be0);
      pmStackY_dd8 = (musig_tweak_vector *)0x154589;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_keypair_create(CTX,&sStack_d40,musig_tweak_vector.sk);
      pmVar184 = (musig_sign_verify_vector *)cache_i;
      aggnonce = (musig_sign_verify_vector *)auStack_be0;
      if (iVar153 == 0) goto LAB_00154cc8;
      pmVar184 = (musig_sign_verify_vector *)(musig_tweak_vector.valid_case + (long)keyagg_cache_00)
      ;
      pmVar176 = (musig_sign_verify_vector *)auStack_a60;
      pmStackY_dd8 = (musig_tweak_vector *)0x1545f2;
      iVar153 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)pmVar176,(secp256k1_musig_keyagg_cache *)keyagg_cache,
                           (uchar *)0x0,musig_tweak_vector.pubkeys,musig_tweak_vector.tweaks,
                           *(size_t *)pmVar184->sk,
                           musig_tweak_vector.valid_case[(long)keyagg_cache_00].key_indices,
                           musig_tweak_vector.valid_case[(long)keyagg_cache_00].tweak_indices_len,
                           musig_tweak_vector.valid_case[(long)keyagg_cache_00].tweak_indices,
                           musig_tweak_vector.valid_case[(long)keyagg_cache_00].is_xonly);
      pmVar171 = sha2;
      if (iVar153 == 0) goto LAB_00154ccd;
      pmVar171 = (musig_sign_verify_vector *)auStack_700;
      pmStackY_dd8 = (musig_tweak_vector *)0x154626;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_nonce_process
                          (CTX,(secp256k1_musig_session *)pmVar171,
                           (secp256k1_musig_aggnonce *)auStack_b60,musig_tweak_vector.msg,
                           (secp256k1_musig_keyagg_cache *)keyagg_cache);
      if (iVar153 == 0) goto LAB_00154cd2;
      pmStackY_dd8 = (musig_tweak_vector *)0x154655;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_partial_sign
                          (CTX,asStack_d90,(secp256k1_musig_secnonce *)auStack_a20,&sStack_d40,
                           (secp256k1_musig_keyagg_cache *)keyagg_cache,
                           (secp256k1_musig_session *)pmVar171);
      if (iVar153 == 0) goto LAB_00154cd7;
      lVar164 = 0;
      do {
        pmVar171 = (musig_sign_verify_vector *)
                   (ulong)((uint)asStack_d90[0].data[lVar164] -
                          (uint)secp256k1_musig_partial_sig_magic[lVar164]);
        if (asStack_d90[0].data[lVar164] != secp256k1_musig_partial_sig_magic[lVar164])
        goto LAB_00154690;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 4);
      pmVar171 = (musig_sign_verify_vector *)0x0;
LAB_00154690:
      pmVar170 = sha2;
      if ((int)pmVar171 != 0) {
        pmStackY_dd8 = (musig_tweak_vector *)0x15477e;
        pmVar176 = (musig_sign_verify_vector *)CTX;
        run_musig_tests_cold_40();
        aggnonce = (musig_sign_verify_vector *)cache_i;
        goto LAB_00154cdc;
      }
      puVar160 = asStack_d90[0].data + 4;
      auStack_c20[0x10] = asStack_d90[0].data[0x14];
      auStack_c20[0x11] = asStack_d90[0].data[0x15];
      auStack_c20[0x12] = asStack_d90[0].data[0x16];
      auStack_c20[0x13] = asStack_d90[0].data[0x17];
      auStack_c20[0x14] = asStack_d90[0].data[0x18];
      auStack_c20[0x15] = asStack_d90[0].data[0x19];
      auStack_c20[0x16] = asStack_d90[0].data[0x1a];
      auStack_c20[0x17] = asStack_d90[0].data[0x1b];
      auStack_c20[0x18] = asStack_d90[0].data[0x1c];
      auStack_c20[0x19] = asStack_d90[0].data[0x1d];
      auStack_c20[0x1a] = asStack_d90[0].data[0x1e];
      auStack_c20[0x1b] = asStack_d90[0].data[0x1f];
      auStack_c20[0x1c] = asStack_d90[0].data[0x20];
      auStack_c20[0x1d] = asStack_d90[0].data[0x21];
      auStack_c20[0x1e] = asStack_d90[0].data[0x22];
      auStack_c20[0x1f] = asStack_d90[0].data[0x23];
      auStack_c20[0] = asStack_d90[0].data[4];
      auStack_c20[1] = asStack_d90[0].data[5];
      auStack_c20[2] = asStack_d90[0].data[6];
      auStack_c20[3] = asStack_d90[0].data[7];
      auStack_c20[4] = asStack_d90[0].data[8];
      auStack_c20[5] = asStack_d90[0].data[9];
      auStack_c20[6] = asStack_d90[0].data[10];
      auStack_c20[7] = asStack_d90[0].data[0xb];
      auStack_c20[8] = asStack_d90[0].data[0xc];
      auStack_c20[9] = asStack_d90[0].data[0xd];
      auStack_c20[10] = asStack_d90[0].data[0xe];
      auStack_c20[0xb] = asStack_d90[0].data[0xf];
      auStack_c20[0xc] = asStack_d90[0].data[0x10];
      auStack_c20[0xd] = asStack_d90[0].data[0x11];
      auStack_c20[0xe] = asStack_d90[0].data[0x12];
      auStack_c20[0xf] = asStack_d90[0].data[0x13];
      lVar164 = 0;
      aggnonce = (musig_sign_verify_vector *)auStack_be0;
      do {
        puVar159 = (uchar *)((ulong)puVar160 & 0xffffffff);
        bVar188 = auStack_c20[lVar164];
        bVar2 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)
                                 ((musig_sign_verify_vector *)keyagg_cache_01)->sk)->scalar_offset).
                                d + lVar164 + -8);
        pmVar176 = (musig_sign_verify_vector *)(ulong)bVar2;
        puVar160 = (uchar *)(ulong)((uint)bVar188 - (uint)bVar2);
        if (bVar188 == bVar2) {
          puVar160 = puVar159;
        }
        iVar153 = (int)puVar160;
        if (bVar188 != bVar2) goto LAB_001546f2;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x20);
      iVar153 = 0;
LAB_001546f2:
      if (iVar153 != 0) goto LAB_00154ce1;
      pmStackY_dd8 = (musig_tweak_vector *)0x154724;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_pubnonce_parse
                          (CTX,(secp256k1_musig_pubnonce *)sha2,
                           musig_tweak_vector.pubnonces
                           [*(long *)((long)keyagg_cache_00 * 0xa0 + 0x1af428 +
                                     musig_tweak_vector.valid_case[(long)keyagg_cache_00].
                                     signer_index * 8)]);
      keyagg_cache = (musig_nonce_agg_vector *)cache_i;
      pmVar184 = (musig_sign_verify_vector *)cache_i;
      if (iVar153 == 0) goto LAB_00154ce6;
      keyagg_cache = (musig_nonce_agg_vector *)auStack_940;
      pmStackY_dd8 = (musig_tweak_vector *)0x154756;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_partial_sig_verify
                          (CTX,asStack_d90,(secp256k1_musig_pubnonce *)sha2,
                           (secp256k1_pubkey *)aggnonce,(secp256k1_musig_keyagg_cache *)keyagg_cache
                           ,(secp256k1_musig_session *)auStack_700);
      if (iVar153 == 0) goto LAB_00154ceb;
      keyagg_cache_00 =
           (musig_sign_verify_vector *)
           ((long)&((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->built + 1);
      keyagg_cache_01 =
           (musig_key_agg_vector *)
           (((musig_sign_verify_vector *)keyagg_cache_01)->pubkeys[3] + 0x1d);
    } while (keyagg_cache_00 != (musig_sign_verify_vector *)0x5);
LAB_0015479c:
    pmVar176 = (musig_sign_verify_vector *)auStack_700;
    pmStackY_dd8 = (musig_tweak_vector *)0x1547f3;
    iVar153 = musig_vectors_keyagg_and_tweak
                        ((MUSIG_ERROR *)pmVar176,(secp256k1_musig_keyagg_cache *)auStack_940,
                         (uchar *)0x0,musig_tweak_vector.pubkeys,musig_tweak_vector.tweaks,3,
                         musig_tweak_vector.error_case[0].key_indices,1,
                         musig_tweak_vector.error_case[0].tweak_indices,
                         musig_tweak_vector.error_case[0].is_xonly);
    if (iVar153 != 0) goto LAB_00154d54;
    pmVar172 = (musig_sig_agg_vector *)sha2;
    if (auStack_700._0_4_ != 1) goto LAB_00154d59;
    keyagg_cache = (musig_nonce_agg_vector *)musig_sig_agg_vector.valid_case[0].psig_indices;
    keyagg_cache_00 = (musig_sign_verify_vector *)musig_sig_agg_vector.valid_case[0].expected;
    keyagg_cache_01 = (musig_key_agg_vector *)0x0;
    pmVar172 = &musig_sig_agg_vector;
    do {
      pmVar171 = (musig_sign_verify_vector *)((long)keyagg_cache_01 * 0xe8);
      pmVar176 = (musig_sign_verify_vector *)auStack_c20;
      pmStackY_dd8 = (musig_tweak_vector *)0x154881;
      iVar153 = musig_vectors_keyagg_and_tweak
                          ((MUSIG_ERROR *)pmVar176,(secp256k1_musig_keyagg_cache *)auStack_700,
                           asStack_d90[0].data,(uchar (*) [33])&musig_sig_agg_vector,
                           musig_sig_agg_vector.tweaks,
                           *(size_t *)(pmVar171[0x224].pubnonces[3] + 0x1a),
                           (size_t *)(pmVar171[0x224].pubnonces[3] + 0x22),
                           *(size_t *)(pmVar171[0x224].pubnonces[3] + 0x32),
                           (size_t *)(pmVar171[0x224].pubnonces[3] + 0x3a),
                           (int *)(pmVar171[0x224].pubnonces[3] + 0x52));
      aggnonce = pmVar171;
      if (iVar153 == 0) goto LAB_00154cf5;
      aggnonce = (musig_sign_verify_vector *)(pmVar171[0x224].pubnonces[3] + 0x1a);
      cache_i = (musig_tweak_vector *)auStack_a20;
      pmStackY_dd8 = (musig_tweak_vector *)0x1548ae;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_aggnonce_parse
                          (CTX,(secp256k1_musig_aggnonce *)cache_i,
                           pmVar171[0x224].pubnonces[3] + 0x5e);
      if (iVar153 == 0) goto LAB_00154cfa;
      pmStackY_dd8 = (musig_tweak_vector *)0x1548dc;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_nonce_process
                          (CTX,(secp256k1_musig_session *)auStack_b60,
                           (secp256k1_musig_aggnonce *)cache_i,musig_sig_agg_vector.msg,
                           (secp256k1_musig_keyagg_cache *)auStack_700);
      sha2 = (musig_sign_verify_vector *)pmVar172;
      pmVar184 = (musig_sign_verify_vector *)cache_i;
      if (iVar153 == 0) goto LAB_00154cff;
      pmVar171 = *(musig_sign_verify_vector **)(pmVar171[0x224].pubnonces[3] + 0xa2);
      if (pmVar171 != (musig_sign_verify_vector *)0x0) {
        aggnonce = (musig_sign_verify_vector *)auStack_940;
        cache_i = (musig_tweak_vector *)0x0;
        do {
          pmStackY_dd8 = (musig_tweak_vector *)0x154923;
          pmVar176 = (musig_sign_verify_vector *)CTX;
          iVar153 = secp256k1_musig_partial_sig_parse
                              (CTX,(secp256k1_musig_partial_sig *)aggnonce,
                               musig_sig_agg_vector.psigs
                               [*(size_t *)
                                 ((long)*(uchar (*) [66])((musig_tweak_vector *)keyagg_cache)->sk +
                                 cache_i * 8)]);
          if (iVar153 == 0) goto LAB_00154bf1;
          *(musig_sign_verify_vector **)(auStack_cb0 + (long)cache_i * 8) = aggnonce;
          cache_i = (musig_tweak_vector *)
                    ((long)&((secp256k1_ecmult_gen_context *)
                            ((musig_sign_verify_vector *)cache_i)->sk)->built + 1);
          aggnonce = (musig_sign_verify_vector *)
                     ((long)(((secp256k1_ecmult_gen_context *)aggnonce->sk)->scalar_offset).d + 0x1c
                     );
        } while (pmVar171 != (musig_sign_verify_vector *)cache_i);
      }
      aggnonce = (musig_sign_verify_vector *)&sStack_d40;
      pmStackY_dd8 = (musig_tweak_vector *)0x154969;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_partial_sig_agg
                          (CTX,(uchar *)aggnonce,(secp256k1_musig_session *)auStack_b60,
                           (secp256k1_musig_partial_sig **)auStack_cb0,(size_t)pmVar171);
      if (iVar153 != 1) goto LAB_00154d09;
      lVar164 = 0;
      cache_i = (musig_tweak_vector *)auStack_be0;
      do {
        bVar188 = *(byte *)((long)(((secp256k1_ecmult_gen_context *)keyagg_cache_00->sk)->
                                  scalar_offset).d + lVar164 + -8);
        pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
        iVar153 = (uint)sStack_d40.data[lVar164] - (uint)bVar188;
        if (sStack_d40.data[lVar164] != bVar188) goto LAB_001549a7;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x40);
      iVar153 = 0;
LAB_001549a7:
      if (iVar153 != 0) goto LAB_00154d0e;
      pmStackY_dd8 = (musig_tweak_vector *)0x1549c3;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)cache_i,asStack_d90[0].data);
      if (iVar153 == 0) goto LAB_00154d13;
      pmStackY_dd8 = (musig_tweak_vector *)0x1549e9;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)aggnonce,musig_sig_agg_vector.msg,0x20,
                           (secp256k1_xonly_pubkey *)cache_i);
      if (iVar153 == 0) goto LAB_00154d18;
      keyagg_cache_01 =
           (musig_key_agg_vector *)
           ((long)&((secp256k1_ecmult_gen_context *)
                   ((musig_sign_verify_vector *)keyagg_cache_01)->sk)->built + 1);
      keyagg_cache = (musig_nonce_agg_vector *)
                     (((musig_tweak_vector *)keyagg_cache)->pubkeys[0] + 5);
      keyagg_cache_00 = (musig_sign_verify_vector *)(keyagg_cache_00->secnonces[0] + 0x44);
    } while ((musig_sign_verify_vector *)keyagg_cache_01 != (musig_sign_verify_vector *)0x4);
    aggnonce = (musig_sign_verify_vector *)auStack_940;
    keyagg_cache_01 = (musig_key_agg_vector *)0x0;
    do {
      pmStackY_dd8 = (musig_tweak_vector *)0x154a3a;
      pmVar176 = (musig_sign_verify_vector *)CTX;
      iVar153 = secp256k1_musig_partial_sig_parse
                          (CTX,(secp256k1_musig_partial_sig *)aggnonce,
                           musig_sig_agg_vector.psigs
                           [musig_sig_agg_vector.error_case[0].psig_indices[(long)keyagg_cache_01]])
      ;
      if ((int)keyagg_cache_01 == iVar153) goto LAB_00154d1d;
      keyagg_cache_01 =
           (musig_key_agg_vector *)
           ((long)&((secp256k1_ecmult_gen_context *)
                   ((musig_sign_verify_vector *)keyagg_cache_01)->sk)->built + 1);
      aggnonce = (musig_sign_verify_vector *)
                 ((long)(((secp256k1_ecmult_gen_context *)aggnonce->sk)->scalar_offset).d + 0x1c);
    } while ((musig_sign_verify_vector *)keyagg_cache_01 == (musig_sign_verify_vector *)0x1);
    sStack_d40.data[0x10] = '=';
    sStack_d40.data[0x11] = 'F';
    sStack_d40.data[0x12] = 'J';
    sStack_d40.data[0x13] = 'Y';
    sStack_d40.data[0x14] = 0xfe;
    sStack_d40.data[0x15] = 'l';
    sStack_d40.data[0x16] = 0x96;
    sStack_d40.data[0x17] = 0xa7;
    sStack_d40.data[0x18] = 0xef;
    sStack_d40.data[0x19] = 0xe8;
    sStack_d40.data[0x1a] = 'q';
    sStack_d40.data[0x1b] = 0xf0;
    sStack_d40.data[0x1c] = '|';
    sStack_d40.data[0x1d] = 'Z';
    sStack_d40.data[0x1e] = 0xef;
    sStack_d40.data[0x1f] = 'T';
    sStack_d40.data._0_8_ = (secp256k1_musig_pubnonce *)0xc554721b7dcbc1ee;
    sStack_d40.data[8] = 0xca;
    sStack_d40.data[9] = 0xb0;
    sStack_d40.data[10] = 0xd9;
    sStack_d40.data[0xb] = 0xc6;
    sStack_d40.data[0xc] = '\x1a';
    sStack_d40.data[0xd] = 0xb0;
    sStack_d40.data[0xe] = '.';
    sStack_d40.data[0xf] = 'd';
    pmStackY_dd8 = (musig_tweak_vector *)0x154a81;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)auStack_b60,sStack_d40.data);
    if (iVar153 == 0) goto LAB_00154d5e;
    auStack_cb0[0x30] = auStack_b10[0];
    auStack_cb0[0x31] = auStack_b10[1];
    auStack_cb0[0x32] = auStack_b10[2];
    auStack_cb0[0x33] = auStack_b10[3];
    auStack_cb0[0x34] = auStack_b10[4];
    auStack_cb0[0x35] = auStack_b10[5];
    auStack_cb0[0x36] = auStack_b10[6];
    auStack_cb0[0x37] = auStack_b10[7];
    auStack_cb0[0x38] = auStack_b08[0];
    auStack_cb0[0x39] = auStack_b08[1];
    auStack_cb0[0x3a] = auStack_b08[2];
    auStack_cb0[0x3b] = auStack_b08[3];
    auStack_cb0[0x3c] = auStack_b08[4];
    auStack_cb0[0x3d] = auStack_b08[5];
    auStack_cb0[0x3e] = auStack_b08[6];
    auStack_cb0[0x3f] = auStack_b08[7];
    auStack_cb0[0x20] = auStack_b20[0];
    auStack_cb0[0x21] = auStack_b20[1];
    auStack_cb0[0x22] = auStack_b20[2];
    auStack_cb0[0x23] = auStack_b20[3];
    auStack_cb0[0x24] = auStack_b20[4];
    auStack_cb0[0x25] = auStack_b20[5];
    auStack_cb0[0x26] = auStack_b20[6];
    auStack_cb0[0x27] = auStack_b20[7];
    auStack_cb0[0x28] = auStack_b18[0];
    auStack_cb0[0x29] = auStack_b18[1];
    auStack_cb0[0x2a] = auStack_b18[2];
    auStack_cb0[0x2b] = auStack_b18[3];
    auStack_cb0[0x2c] = auStack_b18[4];
    auStack_cb0[0x2d] = auStack_b18[5];
    auStack_cb0[0x2e] = auStack_b18[6];
    auStack_cb0[0x2f] = auStack_b18[7];
    auStack_cb0[0x10] = auStack_b30[0];
    auStack_cb0[0x11] = auStack_b30[1];
    auStack_cb0[0x12] = auStack_b30[2];
    auStack_cb0[0x13] = auStack_b30[3];
    auStack_cb0[0x14] = auStack_b30[4];
    auStack_cb0[0x15] = auStack_b30[5];
    auStack_cb0[0x16] = auStack_b30[6];
    auStack_cb0[0x17] = auStack_b30[7];
    auStack_cb0[0x18] = auStack_b28[0];
    auStack_cb0[0x19] = auStack_b28[1];
    auStack_cb0[0x1a] = auStack_b28[2];
    auStack_cb0[0x1b] = auStack_b28[3];
    auStack_cb0[0x1c] = auStack_b28[4];
    auStack_cb0[0x1d] = auStack_b28[5];
    auStack_cb0[0x1e] = auStack_b28[6];
    auStack_cb0[0x1f] = auStack_b28[7];
    auStack_cb0._0_8_ = auStack_b60._32_8_;
    auStack_cb0[8] = auStack_b38[0];
    auStack_cb0[9] = auStack_b38[1];
    auStack_cb0[10] = auStack_b38[2];
    auStack_cb0[0xb] = auStack_b38[3];
    auStack_cb0[0xc] = auStack_b38[4];
    auStack_cb0[0xd] = auStack_b38[5];
    auStack_cb0[0xe] = auStack_b38[6];
    auStack_cb0[0xf] = auStack_b38[7];
    uVar165 = 0;
    pmStackY_dd8 = (musig_tweak_vector *)0x154aed;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_nonce_gen_counter
                        (CTX,(secp256k1_musig_secnonce *)auStack_940,
                         (secp256k1_musig_pubnonce *)auStack_700,0,(secp256k1_keypair *)auStack_b60,
                         (uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar153 == 0) goto LAB_00154d63;
    uVar173 = 0;
    do {
      uVar175 = uVar165 & 0xffffffff;
      bVar188 = auStack_940[uVar173 + 4];
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
      bVar2 = (&DAT_001afe70)[uVar173];
      uVar165 = (ulong)((uint)bVar188 - (uint)bVar2);
      if (bVar188 == bVar2) {
        uVar165 = uVar175;
      }
      iVar153 = (int)uVar165;
      if (bVar188 != bVar2) goto LAB_00154b25;
      uVar173 = uVar173 + 1;
    } while (uVar173 != 0x40);
    iVar153 = 0;
LAB_00154b25:
    if (iVar153 != 0) goto LAB_00154d68;
    uVar165 = 0;
    do {
      uVar175 = uVar173 & 0xffffffff;
      bVar188 = auStack_900[uVar165 + 4];
      bVar2 = auStack_cb0[uVar165];
      pmVar176 = (musig_sign_verify_vector *)(ulong)bVar2;
      uVar173 = (ulong)((uint)bVar188 - (uint)bVar2);
      if (bVar188 == bVar2) {
        uVar173 = uVar175;
      }
      iVar153 = (int)uVar173;
      if (bVar188 != bVar2) goto LAB_00154b58;
      uVar165 = uVar165 + 1;
    } while (uVar165 != 0x40);
    iVar153 = 0;
LAB_00154b58:
    if (iVar153 != 0) goto LAB_00154d6d;
    pmStackY_dd8 = (musig_tweak_vector *)0x154b7c;
    pmVar176 = (musig_sign_verify_vector *)CTX;
    iVar153 = secp256k1_musig_pubnonce_serialize
                        (CTX,auStack_a20,(secp256k1_musig_pubnonce *)auStack_700);
    if (iVar153 != 0) {
      lVar164 = 0;
      do {
        uVar173 = uVar165 & 0xffffffff;
        bVar188 = auStack_a20[lVar164];
        pmVar176 = (musig_sign_verify_vector *)(ulong)bVar188;
        bVar2 = (&DAT_001afeb0)[lVar164];
        uVar165 = (ulong)((uint)bVar188 - (uint)bVar2);
        if (bVar188 == bVar2) {
          uVar165 = uVar173;
        }
        iVar153 = (int)uVar165;
        if (bVar188 != bVar2) goto LAB_00154bb4;
        lVar164 = lVar164 + 1;
      } while (lVar164 != 0x42);
      iVar153 = 0;
LAB_00154bb4:
      if (iVar153 == 0) {
        return;
      }
      goto LAB_00154d77;
    }
  }
  pmStackY_dd8 = (musig_tweak_vector *)0x154d77;
  run_musig_tests_cold_51();
LAB_00154d77:
  pmStackY_dd8 = (musig_tweak_vector *)secp256k1_ge_is_valid_var;
  run_musig_tests_cold_50();
  if ((int)(((secp256k1_ecmult_gen_context *)pmVar176->sk)->ge_offset).y.n[0] != 0) {
    return;
  }
  uVar165 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->ge_offset).x.n[0];
  uVar173 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->ge_offset).x.n[1];
  uVar175 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->ge_offset).x.n[3];
  uVar5 = uVar165 * 2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar175;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar5;
  uVar183 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->ge_offset).x.n[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar183;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar173 * 2;
  uVar4 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->ge_offset).x.n[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar4;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = SUB168(auVar8 * auVar81,0);
  auVar6 = auVar6 * auVar79 + auVar7 * auVar80 + auVar9 * ZEXT816(0x1000003d10);
  uVar4 = uVar4 * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar4;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar165;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar175;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar173 * 2;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar183;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar183;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = SUB168(auVar8 * auVar81,8);
  auVar7 = auVar13 * ZEXT816(0x1000003d10000) +
           auVar10 * auVar82 + auVar12 * auVar84 + auVar11 * auVar83 + (auVar6 >> 0x34);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar165;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = uVar165;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar173;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar175;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar183 * 2;
  auVar8 = auVar16 * auVar87 + auVar15 * auVar86 + (auVar7 >> 0x34);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar7._6_2_ & 0xf);
  auVar9 = auVar14 * auVar85 + auVar17 * ZEXT816(0x1000003d1);
  uVar161 = auVar9._0_8_;
  uVar165 = auVar9._8_8_;
  auVar145._8_8_ = uVar165 >> 0x34;
  auVar145._0_8_ = uVar165 * 0x1000 | uVar161 >> 0x34;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar173;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar5;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar4;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar183;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar175;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar175;
  auVar8 = auVar20 * auVar90 + auVar19 * auVar89 + (auVar8 >> 0x34);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar145 = auVar18 * auVar88 + auVar21 * ZEXT816(0x1000003d10) + auVar145;
  uVar162 = auVar145._0_8_;
  uVar165 = auVar145._8_8_;
  auVar134._8_8_ = uVar165 >> 0x34;
  auVar134._0_8_ = uVar165 * 0x1000 | uVar162 >> 0x34;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar183;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar5;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar173;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar173;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar4;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar175;
  auVar8 = auVar24 * auVar93 + (auVar8 >> 0x34);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar8._0_8_;
  auVar134 = auVar25 * ZEXT816(0x1000003d10) + auVar23 * auVar92 + auVar22 * auVar91 + auVar134;
  auVar9 = auVar134 >> 0x34;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = auVar9._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar8._8_8_;
  auVar137._8_8_ = auVar9._8_8_;
  auVar137._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar138 = auVar26 * ZEXT816(0x1000003d10000) + auVar137 + auVar138;
  uVar174 = auVar138._0_8_;
  uVar173 = *(ulong *)pmVar176->sk;
  uVar175 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->scalar_offset).d[2];
  uVar165 = uVar173 * 2;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar175;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar165;
  uVar183 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->scalar_offset).d[0];
  uVar4 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->scalar_offset).d[1];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar4;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar183 * 2;
  uVar5 = (((secp256k1_ecmult_gen_context *)pmVar176->sk)->scalar_offset).d[3];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar5;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar5;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SUB168(auVar29 * auVar96,0);
  auVar6 = auVar30 * ZEXT816(0x1000003d10) + auVar28 * auVar95 + auVar27 * auVar94;
  uVar163 = uVar5 * 2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar163;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar173;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar175;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar183 * 2;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar4;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar4;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = SUB168(auVar29 * auVar96,8);
  auVar10 = auVar34 * ZEXT816(0x1000003d10000) +
            auVar31 * auVar97 + auVar33 * auVar99 + auVar32 * auVar98 + (auVar6 >> 0x34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar173;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar173;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar163;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar183;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar175;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar4 * 2;
  auVar8 = auVar37 * auVar102 + auVar36 * auVar101 + (auVar10 >> 0x34);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar10._6_2_ & 0xf);
  auVar9 = auVar38 * ZEXT816(0x1000003d1) + auVar35 * auVar100;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar183;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar165;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar163;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar4;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar175;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar175;
  auVar8 = auVar41 * auVar105 + auVar40 * auVar104 + (auVar8 >> 0x34);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar11 = (auVar9 >> 0x34) + auVar39 * auVar103 + auVar42 * ZEXT816(0x1000003d10);
  uVar177 = auVar11._0_8_;
  uVar178 = auVar11._8_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar4;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar165;
  auVar135._8_8_ = uVar178 >> 0x34;
  auVar135._0_8_ = uVar178 * 0x1000 | uVar177 >> 0x34;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar183;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar183;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar163;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar175;
  auVar8 = auVar45 * auVar108 + (auVar8 >> 0x34);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = auVar8._0_8_;
  auVar135 = auVar43 * auVar106 + auVar44 * auVar107 + auVar46 * ZEXT816(0x1000003d10) + auVar135;
  auVar11 = auVar135 >> 0x34;
  auVar139._8_8_ = auVar11._8_8_;
  auVar139._0_8_ = auVar6._0_8_ & 0xffffffffffffe;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = auVar11._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar8._8_8_;
  auVar140 = auVar47 * ZEXT816(0x1000003d10000) + auVar139 + auVar140;
  uVar178 = auVar140._0_8_;
  uVar165 = auVar9._0_8_ & 0xfffffffffffff;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar165;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar175;
  uVar179 = (auVar140._8_8_ << 0xc | uVar178 >> 0x34) + (auVar10._0_8_ & 0xffffffffffff);
  uVar177 = uVar177 & 0xfffffffffffff;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar177;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar4;
  uVar185 = auVar135._0_8_ & 0xfffffffffffff;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar185;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar183;
  uVar178 = uVar178 & 0xfffffffffffff;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar178;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar173;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar179;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar5;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = SUB168(auVar52 * auVar113,0);
  auVar10 = auVar49 * auVar110 + auVar48 * auVar109 + auVar50 * auVar111 + auVar51 * auVar112 +
            auVar53 * ZEXT816(0x1000003d10);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar165;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar5;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar177;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar175;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar185;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar4;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar178;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar183;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar179;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar173;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = SUB168(auVar52 * auVar113,8);
  auVar6 = auVar59 * ZEXT816(0x1000003d10000) +
           auVar58 * auVar118 +
           auVar57 * auVar117 + auVar56 * auVar116 + auVar55 * auVar115 + auVar54 * auVar114 +
           (auVar10 >> 0x34);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar165;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar173;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = uVar177;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar5;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar185;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar175;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar178;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar4;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar179;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar183;
  auVar8 = auVar64 * auVar123 + auVar63 * auVar122 + auVar62 * auVar121 + auVar61 * auVar120 +
           (auVar6 >> 0x34);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (auVar8._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
  auVar9 = auVar65 * ZEXT816(0x1000003d1) + auVar60 * auVar119;
  uVar163 = auVar9._0_8_;
  uVar181 = auVar9._8_8_;
  auVar136._8_8_ = uVar181 >> 0x34;
  auVar136._0_8_ = uVar181 * 0x1000 | uVar163 >> 0x34;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar165;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar183;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = uVar177;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar173;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar185;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar5;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar178;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar175;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar179;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar4;
  auVar8 = auVar70 * auVar128 + auVar69 * auVar127 + auVar68 * auVar126 + (auVar8 >> 0x34);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
  auVar136 = auVar71 * ZEXT816(0x1000003d10) + auVar67 * auVar125 + auVar66 * auVar124 + auVar136;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar165;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar4;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar177;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar183;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar185;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar173;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar178;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar5;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar179;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar175;
  auVar8 = auVar76 * auVar133 + auVar75 * auVar132 + (auVar8 >> 0x34);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = auVar8._0_8_;
  auVar9 = auVar77 * ZEXT816(0x1000003d10) +
           auVar74 * auVar131 + auVar73 * auVar130 + auVar72 * auVar129 + (auVar136 >> 0x34);
  auVar11 = auVar9 >> 0x34;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = auVar11._0_8_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = auVar8._8_8_;
  auVar141._8_8_ = auVar11._8_8_;
  auVar141._0_8_ = auVar10._0_8_ & 0xfffffffffffff;
  auVar142 = auVar78 * ZEXT816(0x1000003d10000) + auVar141 + auVar142;
  uVar165 = auVar142._0_8_;
  sStackY_e28.n[1] =
       (0x3ffffffffffffc - (uVar162 & 0xfffffffffffff)) + (auVar136._0_8_ & 0xfffffffffffff);
  sStackY_e28.n[2] =
       (0x3ffffffffffffc - (auVar134._0_8_ & 0xfffffffffffff)) + (auVar9._0_8_ & 0xfffffffffffff);
  sStackY_e28.n[3] = (0x3ffffffffffffc - (uVar174 & 0xfffffffffffff)) + (uVar165 & 0xfffffffffffff);
  sStackY_e28.n[0] = ((uVar163 & 0xfffffffffffff) - (uVar161 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
  sStackY_e28.n[4] =
       ((auVar6._0_8_ & 0xffffffffffff) -
       ((auVar138._8_8_ << 0xc | uVar174 >> 0x34) + (auVar7._0_8_ & 0xffffffffffff))) +
       0x3fffffffffffc + (auVar142._8_8_ << 0xc | uVar165 >> 0x34);
  pmStackY_e00 = (musig_sign_verify_vector *)pmVar172;
  pmStackY_df8 = keyagg_cache_00;
  pmStackY_df0 = (musig_sign_verify_vector *)cache_i;
  pmStackY_de8 = aggnonce;
  pmStackY_de0 = (musig_sign_verify_vector *)keyagg_cache_01;
  pmStackY_dd8 = (musig_tweak_vector *)keyagg_cache;
  secp256k1_fe_impl_normalizes_to_zero(&sStackY_e28);
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}